

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O1

void embree::avx::CurveNiIntersectorK<8,4>::
     intersect_n<embree::avx::OrientedCurve1IntersectorK<embree::BSplineCurveT,4>,embree::avx::Intersect1KEpilog1<4,true>>
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  float *pfVar1;
  undefined4 uVar2;
  undefined8 uVar3;
  ulong uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  Primitive PVar8;
  uint uVar9;
  Geometry *pGVar10;
  RTCFilterFunctionN p_Var11;
  void *pvVar12;
  __int_type_conflict _Var13;
  long lVar14;
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  float fVar23;
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  bool bVar62;
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  uint uVar67;
  uint uVar68;
  uint uVar69;
  ulong uVar71;
  long lVar72;
  ulong uVar73;
  float t1;
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar76 [16];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined8 extraout_XMM1_Qa;
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 extraout_var [56];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar117 [16];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  float fVar150;
  float fVar169;
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  float fVar164;
  float fVar167;
  float fVar172;
  float fVar173;
  float fVar174;
  undefined1 auVar160 [32];
  float fVar165;
  float fVar168;
  float fVar170;
  undefined1 auVar161 [32];
  float fVar166;
  float fVar171;
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  float fVar175;
  float fVar195;
  float fVar196;
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  float fVar198;
  float fVar199;
  float fVar200;
  undefined1 auVar193 [32];
  float fVar197;
  undefined1 auVar194 [32];
  float fVar201;
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar207 [16];
  float fVar216;
  float fVar218;
  float fVar221;
  float fVar222;
  float fVar224;
  undefined1 auVar213 [32];
  float fVar219;
  undefined1 auVar214 [32];
  float fVar217;
  float fVar220;
  float fVar223;
  undefined1 auVar215 [32];
  vfloat4 b0;
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [32];
  undefined1 auVar235 [32];
  undefined1 auVar236 [32];
  undefined1 auVar237 [32];
  undefined1 auVar238 [32];
  undefined1 auVar239 [32];
  undefined1 auVar240 [32];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [32];
  undefined1 auVar250 [32];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [32];
  undefined1 auVar269 [32];
  __m128 a;
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [32];
  undefined1 auVar279 [32];
  undefined1 auVar280 [32];
  float fVar292;
  float fVar293;
  vfloat4 a0;
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  float fVar294;
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  float fVar295;
  float fVar296;
  float fVar297;
  undefined1 auVar290 [32];
  undefined1 auVar291 [32];
  float fVar298;
  float fVar304;
  float fVar305;
  vfloat4 a0_1;
  undefined1 auVar299 [16];
  undefined1 auVar300 [16];
  float fVar306;
  undefined1 auVar301 [16];
  undefined1 auVar302 [16];
  float fVar307;
  float fVar308;
  float fVar309;
  float fVar310;
  float fVar311;
  float fVar312;
  float in_register_0000151c;
  undefined1 auVar303 [32];
  float fVar313;
  undefined1 auVar314 [16];
  undefined1 auVar315 [16];
  undefined1 auVar316 [16];
  undefined1 auVar317 [16];
  undefined1 auVar318 [16];
  undefined1 auVar319 [16];
  undefined1 auVar320 [32];
  float fVar322;
  float fVar323;
  undefined1 auVar321 [32];
  undefined1 auVar325 [16];
  float fVar324;
  undefined1 auVar326 [16];
  float fVar328;
  float fVar329;
  float in_register_0000159c;
  undefined1 auVar327 [32];
  undefined1 auVar330 [16];
  undefined1 auVar331 [16];
  undefined1 auVar332 [16];
  float in_register_000015dc;
  undefined1 auVar334 [64];
  vfloat_impl<4> p00;
  vfloat_impl<4> p02;
  vfloat_impl<4> p01;
  RTCFilterFunctionNArguments args;
  vfloat_impl<4> p03;
  uint mask_stack [4];
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  undefined1 local_5f8 [8];
  float fStack_5f0;
  float fStack_5ec;
  undefined1 local_5c8 [8];
  float fStack_5c0;
  float fStack_5bc;
  undefined1 local_5a8 [8];
  float fStack_5a0;
  float fStack_59c;
  float fStack_598;
  float fStack_594;
  float fStack_590;
  float local_578;
  float fStack_574;
  float fStack_570;
  float fStack_56c;
  float local_558;
  float fStack_554;
  float fStack_550;
  float fStack_54c;
  float local_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  float local_4a8;
  float fStack_4a4;
  float fStack_4a0;
  float fStack_49c;
  float local_498;
  float fStack_494;
  float fStack_490;
  float fStack_48c;
  undefined8 local_478;
  undefined8 uStack_470;
  undefined8 *local_460;
  RTCFilterFunctionNArguments local_458;
  undefined1 local_428 [8];
  float fStack_420;
  float fStack_41c;
  undefined1 local_418 [8];
  float fStack_410;
  float fStack_40c;
  undefined1 local_408 [8];
  float fStack_400;
  float fStack_3fc;
  undefined1 local_3f8 [8];
  float fStack_3f0;
  float fStack_3ec;
  undefined1 local_3e8 [8];
  float fStack_3e0;
  float fStack_3dc;
  undefined1 local_3d8 [8];
  float fStack_3d0;
  float fStack_3cc;
  undefined1 local_3c8 [8];
  float fStack_3c0;
  float fStack_3bc;
  undefined1 local_3b8 [8];
  float fStack_3b0;
  float fStack_3ac;
  undefined1 local_3a8 [8];
  float fStack_3a0;
  float fStack_39c;
  undefined1 auStack_398 [16];
  uint auStack_388 [4];
  undefined1 local_378 [16];
  undefined1 local_368 [16];
  undefined1 local_358 [8];
  float fStack_350;
  float fStack_34c;
  undefined1 local_348 [8];
  float fStack_340;
  float fStack_33c;
  undefined1 local_338 [8];
  float fStack_330;
  float fStack_32c;
  undefined1 local_328 [8];
  float fStack_320;
  float fStack_31c;
  undefined1 local_318 [8];
  float fStack_310;
  float fStack_30c;
  undefined1 local_308 [16];
  undefined1 local_2f8 [16];
  undefined1 local_2e8 [16];
  undefined1 local_2d8 [16];
  undefined1 local_2c8 [16];
  undefined1 local_2b8 [16];
  undefined1 local_2a8 [16];
  undefined1 local_298 [16];
  undefined1 local_288 [16];
  undefined1 local_278 [8];
  float fStack_270;
  float fStack_26c;
  undefined1 local_268 [8];
  float fStack_260;
  float fStack_25c;
  undefined1 local_258 [8];
  float fStack_250;
  float fStack_24c;
  undefined1 local_248 [32];
  float afStack_228 [8];
  RTCHitN local_208 [16];
  undefined1 local_1f8 [16];
  undefined1 local_1e8 [16];
  undefined1 local_1d8 [16];
  undefined1 local_1c8 [16];
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  uint local_198;
  uint uStack_194;
  uint uStack_190;
  uint uStack_18c;
  uint uStack_188;
  uint uStack_184;
  uint uStack_180;
  uint uStack_17c;
  undefined1 local_178 [32];
  undefined1 local_158 [32];
  undefined1 local_138 [32];
  float local_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  float fStack_104;
  float fStack_100;
  float fStack_fc;
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float fStack_e8;
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  float local_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float fStack_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  undefined1 local_b8 [32];
  undefined1 local_98 [32];
  undefined1 local_78 [32];
  ulong auStack_58 [5];
  ulong uVar70;
  undefined1 auVar149 [32];
  undefined1 auVar333 [32];
  
  PVar8 = prim[1];
  uVar73 = (ulong)(byte)PVar8;
  lVar72 = uVar73 * 5;
  auVar96 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x10);
  auVar96 = vinsertps_avx(auVar96,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar205 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                           ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar205 = vinsertps_avx(auVar205,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  fVar175 = *(float *)(prim + uVar73 * 0x19 + 0x12);
  auVar96 = vsubps_avx(auVar96,*(undefined1 (*) [16])(prim + uVar73 * 0x19 + 6));
  auVar87._0_4_ = fVar175 * auVar96._0_4_;
  auVar87._4_4_ = fVar175 * auVar96._4_4_;
  auVar87._8_4_ = fVar175 * auVar96._8_4_;
  auVar87._12_4_ = fVar175 * auVar96._12_4_;
  auVar96 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar73 * 4 + 6)));
  auVar191 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar73 * 4 + 10)));
  auVar176._0_4_ = fVar175 * auVar205._0_4_;
  auVar176._4_4_ = fVar175 * auVar205._4_4_;
  auVar176._8_4_ = fVar175 * auVar205._8_4_;
  auVar176._12_4_ = fVar175 * auVar205._12_4_;
  auVar79._16_16_ = auVar191;
  auVar79._0_16_ = auVar96;
  auVar96 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar72 + 6)));
  auVar79 = vcvtdq2ps_avx(auVar79);
  auVar205 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar72 + 10)));
  auVar123._16_16_ = auVar205;
  auVar123._0_16_ = auVar96;
  auVar15 = vcvtdq2ps_avx(auVar123);
  auVar96 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar73 * 6 + 6)));
  auVar205 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar73 * 6 + 10)));
  auVar142._16_16_ = auVar205;
  auVar142._0_16_ = auVar96;
  auVar96 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar73 * 0xb + 6)));
  auVar205 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar73 * 0xb + 10)));
  auVar16 = vcvtdq2ps_avx(auVar142);
  auVar143._16_16_ = auVar205;
  auVar143._0_16_ = auVar96;
  auVar17 = vcvtdq2ps_avx(auVar143);
  uVar71 = (ulong)((uint)(byte)PVar8 * 0xc);
  auVar96 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar71 + 6)));
  auVar205 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar71 + 10)));
  auVar213._16_16_ = auVar205;
  auVar213._0_16_ = auVar96;
  auVar96 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar71 + uVar73 + 6)));
  auVar18 = vcvtdq2ps_avx(auVar213);
  auVar205 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar71 + uVar73 + 10)));
  auVar234._16_16_ = auVar205;
  auVar234._0_16_ = auVar96;
  lVar14 = uVar73 * 9;
  uVar71 = (ulong)(uint)((int)lVar14 * 2);
  auVar96 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar71 + 6)));
  auVar19 = vcvtdq2ps_avx(auVar234);
  auVar205 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar71 + 10)));
  auVar235._16_16_ = auVar205;
  auVar235._0_16_ = auVar96;
  auVar20 = vcvtdq2ps_avx(auVar235);
  auVar96 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar71 + uVar73 + 6)));
  auVar205 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar71 + uVar73 + 10)));
  auVar268._16_16_ = auVar205;
  auVar268._0_16_ = auVar96;
  uVar71 = (ulong)(uint)((int)lVar72 << 2);
  auVar96 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar71 + 6)));
  auVar205 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar71 + 10)));
  auVar21 = vcvtdq2ps_avx(auVar268);
  auVar278._16_16_ = auVar205;
  auVar278._0_16_ = auVar96;
  auVar22 = vcvtdq2ps_avx(auVar278);
  auVar96 = vshufps_avx(auVar176,auVar176,0);
  auVar205 = vshufps_avx(auVar176,auVar176,0x55);
  auVar191 = vshufps_avx(auVar176,auVar176,0xaa);
  fVar175 = auVar191._0_4_;
  fVar201 = auVar191._4_4_;
  fVar195 = auVar191._8_4_;
  fVar216 = auVar191._12_4_;
  fVar196 = auVar205._0_4_;
  fVar218 = auVar205._4_4_;
  fVar197 = auVar205._8_4_;
  fVar219 = auVar205._12_4_;
  fVar198 = auVar96._0_4_;
  fVar221 = auVar96._4_4_;
  fVar199 = auVar96._8_4_;
  fVar222 = auVar96._12_4_;
  auVar303._0_4_ = fVar198 * auVar79._0_4_ + fVar196 * auVar15._0_4_ + fVar175 * auVar16._0_4_;
  auVar303._4_4_ = fVar221 * auVar79._4_4_ + fVar218 * auVar15._4_4_ + fVar201 * auVar16._4_4_;
  auVar303._8_4_ = fVar199 * auVar79._8_4_ + fVar197 * auVar15._8_4_ + fVar195 * auVar16._8_4_;
  auVar303._12_4_ = fVar222 * auVar79._12_4_ + fVar219 * auVar15._12_4_ + fVar216 * auVar16._12_4_;
  auVar303._16_4_ = fVar198 * auVar79._16_4_ + fVar196 * auVar15._16_4_ + fVar175 * auVar16._16_4_;
  auVar303._20_4_ = fVar221 * auVar79._20_4_ + fVar218 * auVar15._20_4_ + fVar201 * auVar16._20_4_;
  auVar303._24_4_ = fVar199 * auVar79._24_4_ + fVar197 * auVar15._24_4_ + fVar195 * auVar16._24_4_;
  auVar303._28_4_ = fVar219 + in_register_000015dc + in_register_0000151c;
  auVar290._0_4_ = fVar198 * auVar17._0_4_ + fVar196 * auVar18._0_4_ + auVar19._0_4_ * fVar175;
  auVar290._4_4_ = fVar221 * auVar17._4_4_ + fVar218 * auVar18._4_4_ + auVar19._4_4_ * fVar201;
  auVar290._8_4_ = fVar199 * auVar17._8_4_ + fVar197 * auVar18._8_4_ + auVar19._8_4_ * fVar195;
  auVar290._12_4_ = fVar222 * auVar17._12_4_ + fVar219 * auVar18._12_4_ + auVar19._12_4_ * fVar216;
  auVar290._16_4_ = fVar198 * auVar17._16_4_ + fVar196 * auVar18._16_4_ + auVar19._16_4_ * fVar175;
  auVar290._20_4_ = fVar221 * auVar17._20_4_ + fVar218 * auVar18._20_4_ + auVar19._20_4_ * fVar201;
  auVar290._24_4_ = fVar199 * auVar17._24_4_ + fVar197 * auVar18._24_4_ + auVar19._24_4_ * fVar195;
  auVar290._28_4_ = fVar219 + in_register_000015dc + in_register_0000159c;
  auVar193._0_4_ = fVar198 * auVar20._0_4_ + fVar196 * auVar21._0_4_ + auVar22._0_4_ * fVar175;
  auVar193._4_4_ = fVar221 * auVar20._4_4_ + fVar218 * auVar21._4_4_ + auVar22._4_4_ * fVar201;
  auVar193._8_4_ = fVar199 * auVar20._8_4_ + fVar197 * auVar21._8_4_ + auVar22._8_4_ * fVar195;
  auVar193._12_4_ = fVar222 * auVar20._12_4_ + fVar219 * auVar21._12_4_ + auVar22._12_4_ * fVar216;
  auVar193._16_4_ = fVar198 * auVar20._16_4_ + fVar196 * auVar21._16_4_ + auVar22._16_4_ * fVar175;
  auVar193._20_4_ = fVar221 * auVar20._20_4_ + fVar218 * auVar21._20_4_ + auVar22._20_4_ * fVar201;
  auVar193._24_4_ = fVar199 * auVar20._24_4_ + fVar197 * auVar21._24_4_ + auVar22._24_4_ * fVar195;
  auVar193._28_4_ = fVar222 + fVar219 + fVar216;
  auVar96 = vshufps_avx(auVar87,auVar87,0);
  auVar205 = vshufps_avx(auVar87,auVar87,0x55);
  auVar191 = vshufps_avx(auVar87,auVar87,0xaa);
  fVar201 = auVar191._0_4_;
  fVar195 = auVar191._4_4_;
  fVar216 = auVar191._8_4_;
  fVar196 = auVar191._12_4_;
  fVar221 = auVar205._0_4_;
  fVar199 = auVar205._4_4_;
  fVar222 = auVar205._8_4_;
  fVar200 = auVar205._12_4_;
  fVar218 = auVar96._0_4_;
  fVar197 = auVar96._4_4_;
  fVar219 = auVar96._8_4_;
  fVar198 = auVar96._12_4_;
  fVar175 = auVar79._28_4_;
  auVar107._0_4_ = fVar218 * auVar79._0_4_ + fVar221 * auVar15._0_4_ + fVar201 * auVar16._0_4_;
  auVar107._4_4_ = fVar197 * auVar79._4_4_ + fVar199 * auVar15._4_4_ + fVar195 * auVar16._4_4_;
  auVar107._8_4_ = fVar219 * auVar79._8_4_ + fVar222 * auVar15._8_4_ + fVar216 * auVar16._8_4_;
  auVar107._12_4_ = fVar198 * auVar79._12_4_ + fVar200 * auVar15._12_4_ + fVar196 * auVar16._12_4_;
  auVar107._16_4_ = fVar218 * auVar79._16_4_ + fVar221 * auVar15._16_4_ + fVar201 * auVar16._16_4_;
  auVar107._20_4_ = fVar197 * auVar79._20_4_ + fVar199 * auVar15._20_4_ + fVar195 * auVar16._20_4_;
  auVar107._24_4_ = fVar219 * auVar79._24_4_ + fVar222 * auVar15._24_4_ + fVar216 * auVar16._24_4_;
  auVar107._28_4_ = fVar175 + auVar15._28_4_ + auVar16._28_4_;
  auVar124._0_4_ = fVar218 * auVar17._0_4_ + auVar19._0_4_ * fVar201 + fVar221 * auVar18._0_4_;
  auVar124._4_4_ = fVar197 * auVar17._4_4_ + auVar19._4_4_ * fVar195 + fVar199 * auVar18._4_4_;
  auVar124._8_4_ = fVar219 * auVar17._8_4_ + auVar19._8_4_ * fVar216 + fVar222 * auVar18._8_4_;
  auVar124._12_4_ = fVar198 * auVar17._12_4_ + auVar19._12_4_ * fVar196 + fVar200 * auVar18._12_4_;
  auVar124._16_4_ = fVar218 * auVar17._16_4_ + auVar19._16_4_ * fVar201 + fVar221 * auVar18._16_4_;
  auVar124._20_4_ = fVar197 * auVar17._20_4_ + auVar19._20_4_ * fVar195 + fVar199 * auVar18._20_4_;
  auVar124._24_4_ = fVar219 * auVar17._24_4_ + auVar19._24_4_ * fVar216 + fVar222 * auVar18._24_4_;
  auVar124._28_4_ = fVar175 + auVar19._28_4_ + auVar16._28_4_;
  auVar144._8_4_ = 0x7fffffff;
  auVar144._0_8_ = 0x7fffffff7fffffff;
  auVar144._12_4_ = 0x7fffffff;
  auVar144._16_4_ = 0x7fffffff;
  auVar144._20_4_ = 0x7fffffff;
  auVar144._24_4_ = 0x7fffffff;
  auVar144._28_4_ = 0x7fffffff;
  auVar160._8_4_ = 0x219392ef;
  auVar160._0_8_ = 0x219392ef219392ef;
  auVar160._12_4_ = 0x219392ef;
  auVar160._16_4_ = 0x219392ef;
  auVar160._20_4_ = 0x219392ef;
  auVar160._24_4_ = 0x219392ef;
  auVar160._28_4_ = 0x219392ef;
  auVar79 = vandps_avx(auVar303,auVar144);
  auVar79 = vcmpps_avx(auVar79,auVar160,1);
  auVar15 = vblendvps_avx(auVar303,auVar160,auVar79);
  auVar79 = vandps_avx(auVar290,auVar144);
  auVar79 = vcmpps_avx(auVar79,auVar160,1);
  auVar16 = vblendvps_avx(auVar290,auVar160,auVar79);
  auVar79 = vandps_avx(auVar193,auVar144);
  auVar79 = vcmpps_avx(auVar79,auVar160,1);
  auVar79 = vblendvps_avx(auVar193,auVar160,auVar79);
  auVar145._0_4_ = fVar218 * auVar20._0_4_ + fVar221 * auVar21._0_4_ + auVar22._0_4_ * fVar201;
  auVar145._4_4_ = fVar197 * auVar20._4_4_ + fVar199 * auVar21._4_4_ + auVar22._4_4_ * fVar195;
  auVar145._8_4_ = fVar219 * auVar20._8_4_ + fVar222 * auVar21._8_4_ + auVar22._8_4_ * fVar216;
  auVar145._12_4_ = fVar198 * auVar20._12_4_ + fVar200 * auVar21._12_4_ + auVar22._12_4_ * fVar196;
  auVar145._16_4_ = fVar218 * auVar20._16_4_ + fVar221 * auVar21._16_4_ + auVar22._16_4_ * fVar201;
  auVar145._20_4_ = fVar197 * auVar20._20_4_ + fVar199 * auVar21._20_4_ + auVar22._20_4_ * fVar195;
  auVar145._24_4_ = fVar219 * auVar20._24_4_ + fVar222 * auVar21._24_4_ + auVar22._24_4_ * fVar216;
  auVar145._28_4_ = fVar175 + auVar18._28_4_ + fVar196;
  auVar17 = vrcpps_avx(auVar15);
  fVar175 = auVar17._0_4_;
  fVar195 = auVar17._4_4_;
  auVar18._4_4_ = auVar15._4_4_ * fVar195;
  auVar18._0_4_ = auVar15._0_4_ * fVar175;
  fVar196 = auVar17._8_4_;
  auVar18._8_4_ = auVar15._8_4_ * fVar196;
  fVar197 = auVar17._12_4_;
  auVar18._12_4_ = auVar15._12_4_ * fVar197;
  fVar198 = auVar17._16_4_;
  auVar18._16_4_ = auVar15._16_4_ * fVar198;
  fVar199 = auVar17._20_4_;
  auVar18._20_4_ = auVar15._20_4_ * fVar199;
  fVar200 = auVar17._24_4_;
  auVar18._24_4_ = auVar15._24_4_ * fVar200;
  auVar18._28_4_ = auVar193._28_4_;
  auVar236._8_4_ = 0x3f800000;
  auVar236._0_8_ = &DAT_3f8000003f800000;
  auVar236._12_4_ = 0x3f800000;
  auVar236._16_4_ = 0x3f800000;
  auVar236._20_4_ = 0x3f800000;
  auVar236._24_4_ = 0x3f800000;
  auVar236._28_4_ = 0x3f800000;
  auVar18 = vsubps_avx(auVar236,auVar18);
  auVar15 = vrcpps_avx(auVar16);
  fVar175 = fVar175 + fVar175 * auVar18._0_4_;
  fVar195 = fVar195 + fVar195 * auVar18._4_4_;
  fVar196 = fVar196 + fVar196 * auVar18._8_4_;
  fVar197 = fVar197 + fVar197 * auVar18._12_4_;
  fVar198 = fVar198 + fVar198 * auVar18._16_4_;
  fVar199 = fVar199 + fVar199 * auVar18._20_4_;
  fVar200 = fVar200 + fVar200 * auVar18._24_4_;
  fVar201 = auVar15._0_4_;
  fVar216 = auVar15._4_4_;
  auVar19._4_4_ = auVar16._4_4_ * fVar216;
  auVar19._0_4_ = auVar16._0_4_ * fVar201;
  fVar218 = auVar15._8_4_;
  auVar19._8_4_ = auVar16._8_4_ * fVar218;
  fVar219 = auVar15._12_4_;
  auVar19._12_4_ = auVar16._12_4_ * fVar219;
  fVar221 = auVar15._16_4_;
  auVar19._16_4_ = auVar16._16_4_ * fVar221;
  fVar222 = auVar15._20_4_;
  auVar19._20_4_ = auVar16._20_4_ * fVar222;
  fVar224 = auVar15._24_4_;
  auVar19._24_4_ = auVar16._24_4_ * fVar224;
  auVar19._28_4_ = auVar17._28_4_;
  auVar15 = vsubps_avx(auVar236,auVar19);
  fVar201 = fVar201 + fVar201 * auVar15._0_4_;
  fVar216 = fVar216 + fVar216 * auVar15._4_4_;
  fVar218 = fVar218 + fVar218 * auVar15._8_4_;
  fVar219 = fVar219 + fVar219 * auVar15._12_4_;
  fVar221 = fVar221 + fVar221 * auVar15._16_4_;
  fVar222 = fVar222 + fVar222 * auVar15._20_4_;
  fVar224 = fVar224 + fVar224 * auVar15._24_4_;
  auVar15 = vrcpps_avx(auVar79);
  fVar150 = auVar15._0_4_;
  fVar164 = auVar15._4_4_;
  auVar16._4_4_ = fVar164 * auVar79._4_4_;
  auVar16._0_4_ = fVar150 * auVar79._0_4_;
  fVar167 = auVar15._8_4_;
  auVar16._8_4_ = fVar167 * auVar79._8_4_;
  fVar169 = auVar15._12_4_;
  auVar16._12_4_ = fVar169 * auVar79._12_4_;
  fVar172 = auVar15._16_4_;
  auVar16._16_4_ = fVar172 * auVar79._16_4_;
  fVar173 = auVar15._20_4_;
  auVar16._20_4_ = fVar173 * auVar79._20_4_;
  fVar174 = auVar15._24_4_;
  auVar16._24_4_ = fVar174 * auVar79._24_4_;
  auVar16._28_4_ = auVar79._28_4_;
  auVar79 = vsubps_avx(auVar236,auVar16);
  fVar150 = fVar150 + fVar150 * auVar79._0_4_;
  fVar164 = fVar164 + fVar164 * auVar79._4_4_;
  fVar167 = fVar167 + fVar167 * auVar79._8_4_;
  fVar169 = fVar169 + fVar169 * auVar79._12_4_;
  fVar172 = fVar172 + fVar172 * auVar79._16_4_;
  fVar173 = fVar173 + fVar173 * auVar79._20_4_;
  fVar174 = fVar174 + fVar174 * auVar79._24_4_;
  auVar96._8_8_ = 0;
  auVar96._0_8_ = *(ulong *)(prim + uVar73 * 7 + 6);
  auVar96 = vpmovsxwd_avx(auVar96);
  auVar205._8_8_ = 0;
  auVar205._0_8_ = *(ulong *)(prim + uVar73 * 7 + 0xe);
  auVar205 = vpmovsxwd_avx(auVar205);
  auVar80._16_16_ = auVar205;
  auVar80._0_16_ = auVar96;
  auVar79 = vcvtdq2ps_avx(auVar80);
  auVar79 = vsubps_avx(auVar79,auVar107);
  auVar74._0_4_ = fVar175 * auVar79._0_4_;
  auVar74._4_4_ = fVar195 * auVar79._4_4_;
  auVar74._8_4_ = fVar196 * auVar79._8_4_;
  auVar74._12_4_ = fVar197 * auVar79._12_4_;
  auVar17._16_4_ = fVar198 * auVar79._16_4_;
  auVar17._0_16_ = auVar74;
  auVar17._20_4_ = fVar199 * auVar79._20_4_;
  auVar17._24_4_ = fVar200 * auVar79._24_4_;
  auVar17._28_4_ = auVar79._28_4_;
  auVar191._8_8_ = 0;
  auVar191._0_8_ = *(ulong *)(prim + lVar14 + 6);
  auVar96 = vpmovsxwd_avx(auVar191);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = *(ulong *)(prim + lVar14 + 0xe);
  auVar205 = vpmovsxwd_avx(auVar5);
  auVar237._16_16_ = auVar205;
  auVar237._0_16_ = auVar96;
  auVar79 = vcvtdq2ps_avx(auVar237);
  auVar79 = vsubps_avx(auVar79,auVar107);
  auVar88._0_4_ = fVar175 * auVar79._0_4_;
  auVar88._4_4_ = fVar195 * auVar79._4_4_;
  auVar88._8_4_ = fVar196 * auVar79._8_4_;
  auVar88._12_4_ = fVar197 * auVar79._12_4_;
  auVar20._16_4_ = fVar198 * auVar79._16_4_;
  auVar20._0_16_ = auVar88;
  auVar20._20_4_ = fVar199 * auVar79._20_4_;
  auVar20._24_4_ = fVar200 * auVar79._24_4_;
  auVar20._28_4_ = auVar79._28_4_;
  lVar72 = (ulong)(byte)PVar8 * 0x10;
  auVar284._8_8_ = 0;
  auVar284._0_8_ = *(ulong *)(prim + lVar72 + 6);
  auVar96 = vpmovsxwd_avx(auVar284);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = *(ulong *)(prim + lVar72 + 0xe);
  auVar205 = vpmovsxwd_avx(auVar6);
  lVar72 = lVar72 + uVar73 * -2;
  auVar139._8_8_ = 0;
  auVar139._0_8_ = *(ulong *)(prim + lVar72 + 6);
  auVar191 = vpmovsxwd_avx(auVar139);
  auVar95._8_8_ = 0;
  auVar95._0_8_ = *(ulong *)(prim + lVar72 + 0xe);
  auVar5 = vpmovsxwd_avx(auVar95);
  auVar194._16_16_ = auVar5;
  auVar194._0_16_ = auVar191;
  auVar79 = vcvtdq2ps_avx(auVar194);
  auVar79 = vsubps_avx(auVar79,auVar124);
  auVar177._0_4_ = fVar201 * auVar79._0_4_;
  auVar177._4_4_ = fVar216 * auVar79._4_4_;
  auVar177._8_4_ = fVar218 * auVar79._8_4_;
  auVar177._12_4_ = fVar219 * auVar79._12_4_;
  auVar21._16_4_ = fVar221 * auVar79._16_4_;
  auVar21._0_16_ = auVar177;
  auVar21._20_4_ = fVar222 * auVar79._20_4_;
  auVar21._24_4_ = fVar224 * auVar79._24_4_;
  auVar21._28_4_ = auVar79._28_4_;
  auVar238._16_16_ = auVar205;
  auVar238._0_16_ = auVar96;
  auVar79 = vcvtdq2ps_avx(auVar238);
  auVar79 = vsubps_avx(auVar79,auVar124);
  auVar113._0_4_ = fVar201 * auVar79._0_4_;
  auVar113._4_4_ = fVar216 * auVar79._4_4_;
  auVar113._8_4_ = fVar218 * auVar79._8_4_;
  auVar113._12_4_ = fVar219 * auVar79._12_4_;
  auVar22._16_4_ = fVar221 * auVar79._16_4_;
  auVar22._0_16_ = auVar113;
  auVar22._20_4_ = fVar222 * auVar79._20_4_;
  auVar22._24_4_ = fVar224 * auVar79._24_4_;
  auVar22._28_4_ = auVar79._28_4_;
  auVar138._8_8_ = 0;
  auVar138._0_8_ = *(ulong *)(prim + uVar71 + uVar73 + 6);
  auVar96 = vpmovsxwd_avx(auVar138);
  auVar77._8_8_ = 0;
  auVar77._0_8_ = *(ulong *)(prim + uVar71 + uVar73 + 0xe);
  auVar205 = vpmovsxwd_avx(auVar77);
  auVar214._16_16_ = auVar205;
  auVar214._0_16_ = auVar96;
  auVar79 = vcvtdq2ps_avx(auVar214);
  auVar79 = vsubps_avx(auVar79,auVar145);
  auVar202._0_4_ = fVar150 * auVar79._0_4_;
  auVar202._4_4_ = fVar164 * auVar79._4_4_;
  auVar202._8_4_ = fVar167 * auVar79._8_4_;
  auVar202._12_4_ = fVar169 * auVar79._12_4_;
  auVar24._16_4_ = fVar172 * auVar79._16_4_;
  auVar24._0_16_ = auVar202;
  auVar24._20_4_ = fVar173 * auVar79._20_4_;
  auVar24._24_4_ = fVar174 * auVar79._24_4_;
  auVar24._28_4_ = auVar79._28_4_;
  auVar118._8_8_ = 0;
  auVar118._0_8_ = *(ulong *)(prim + uVar73 * 0x17 + 6);
  auVar96 = vpmovsxwd_avx(auVar118);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = *(ulong *)(prim + uVar73 * 0x17 + 0xe);
  auVar205 = vpmovsxwd_avx(auVar7);
  auVar239._16_16_ = auVar205;
  auVar239._0_16_ = auVar96;
  auVar79 = vcvtdq2ps_avx(auVar239);
  auVar79 = vsubps_avx(auVar79,auVar145);
  auVar129._0_4_ = fVar150 * auVar79._0_4_;
  auVar129._4_4_ = fVar164 * auVar79._4_4_;
  auVar129._8_4_ = fVar167 * auVar79._8_4_;
  auVar129._12_4_ = fVar169 * auVar79._12_4_;
  auVar25._16_4_ = fVar172 * auVar79._16_4_;
  auVar25._0_16_ = auVar129;
  auVar25._20_4_ = fVar173 * auVar79._20_4_;
  auVar25._24_4_ = fVar174 * auVar79._24_4_;
  auVar25._28_4_ = auVar79._28_4_;
  auVar96 = vpminsd_avx(auVar17._16_16_,auVar20._16_16_);
  auVar205 = vpminsd_avx(auVar74,auVar88);
  auVar279._16_16_ = auVar96;
  auVar279._0_16_ = auVar205;
  auVar96 = vpminsd_avx(auVar21._16_16_,auVar22._16_16_);
  auVar205 = vpminsd_avx(auVar177,auVar113);
  auVar291._16_16_ = auVar96;
  auVar291._0_16_ = auVar205;
  auVar79 = vmaxps_avx(auVar279,auVar291);
  auVar96 = vpminsd_avx(auVar24._16_16_,auVar25._16_16_);
  auVar205 = vpminsd_avx(auVar202,auVar129);
  auVar320._16_16_ = auVar96;
  auVar320._0_16_ = auVar205;
  uVar2 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar327._4_4_ = uVar2;
  auVar327._0_4_ = uVar2;
  auVar327._8_4_ = uVar2;
  auVar327._12_4_ = uVar2;
  auVar327._16_4_ = uVar2;
  auVar327._20_4_ = uVar2;
  auVar327._24_4_ = uVar2;
  auVar327._28_4_ = uVar2;
  auVar15 = vmaxps_avx(auVar320,auVar327);
  auVar79 = vmaxps_avx(auVar79,auVar15);
  local_178._4_4_ = auVar79._4_4_ * 0.99999964;
  local_178._0_4_ = auVar79._0_4_ * 0.99999964;
  local_178._8_4_ = auVar79._8_4_ * 0.99999964;
  local_178._12_4_ = auVar79._12_4_ * 0.99999964;
  local_178._16_4_ = auVar79._16_4_ * 0.99999964;
  local_178._20_4_ = auVar79._20_4_ * 0.99999964;
  local_178._24_4_ = auVar79._24_4_ * 0.99999964;
  local_178._28_4_ = auVar79._28_4_;
  auVar96 = vpmaxsd_avx(auVar17._16_16_,auVar20._16_16_);
  auVar205 = vpmaxsd_avx(auVar74,auVar88);
  auVar81._16_16_ = auVar96;
  auVar81._0_16_ = auVar205;
  auVar96 = vpmaxsd_avx(auVar21._16_16_,auVar22._16_16_);
  auVar205 = vpmaxsd_avx(auVar177,auVar113);
  auVar108._16_16_ = auVar96;
  auVar108._0_16_ = auVar205;
  auVar79 = vminps_avx(auVar81,auVar108);
  auVar96 = vpmaxsd_avx(auVar24._16_16_,auVar25._16_16_);
  auVar205 = vpmaxsd_avx(auVar202,auVar129);
  auVar109._16_16_ = auVar96;
  auVar109._0_16_ = auVar205;
  uVar2 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar125._4_4_ = uVar2;
  auVar125._0_4_ = uVar2;
  auVar125._8_4_ = uVar2;
  auVar125._12_4_ = uVar2;
  auVar125._16_4_ = uVar2;
  auVar125._20_4_ = uVar2;
  auVar125._24_4_ = uVar2;
  auVar125._28_4_ = uVar2;
  auVar15 = vminps_avx(auVar109,auVar125);
  auVar79 = vminps_avx(auVar79,auVar15);
  auVar15._4_4_ = auVar79._4_4_ * 1.0000004;
  auVar15._0_4_ = auVar79._0_4_ * 1.0000004;
  auVar15._8_4_ = auVar79._8_4_ * 1.0000004;
  auVar15._12_4_ = auVar79._12_4_ * 1.0000004;
  auVar15._16_4_ = auVar79._16_4_ * 1.0000004;
  auVar15._20_4_ = auVar79._20_4_ * 1.0000004;
  auVar15._24_4_ = auVar79._24_4_ * 1.0000004;
  auVar15._28_4_ = auVar79._28_4_;
  auVar79 = vcmpps_avx(local_178,auVar15,2);
  auVar96 = vpshufd_avx(ZEXT116((byte)PVar8),0);
  auVar110._16_16_ = auVar96;
  auVar110._0_16_ = auVar96;
  auVar15 = vcvtdq2ps_avx(auVar110);
  auVar15 = vcmpps_avx(_DAT_02020f40,auVar15,1);
  auVar79 = vandps_avx(auVar79,auVar15);
  uVar67 = vmovmskps_avx(auVar79);
  if (uVar67 == 0) {
    return;
  }
  uVar67 = uVar67 & 0xff;
  auVar82._16_16_ = mm_lookupmask_ps._240_16_;
  auVar82._0_16_ = mm_lookupmask_ps._240_16_;
  local_248 = vblendps_avx(auVar82,ZEXT832(0) << 0x20,0x80);
  local_460 = (undefined8 *)(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
  auVar334 = ZEXT464(0) << 0x20;
LAB_0110d559:
  uVar73 = (ulong)uVar67;
  lVar72 = 0;
  if (uVar73 != 0) {
    for (; (uVar67 >> lVar72 & 1) == 0; lVar72 = lVar72 + 1) {
    }
  }
  uVar67 = *(uint *)(prim + 2);
  uVar9 = *(uint *)(prim + lVar72 * 4 + 6);
  pGVar10 = (context->scene->geometries).items[uVar67].ptr;
  uVar71 = (ulong)*(uint *)(*(long *)&pGVar10->field_0x58 +
                           pGVar10[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * (ulong)uVar9);
  p_Var11 = pGVar10[1].intersectionFilterN;
  pvVar12 = pGVar10[2].userPtr;
  _Var13 = pGVar10[2].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  pfVar1 = (float *)(_Var13 + uVar71 * (long)pvVar12);
  fVar175 = *pfVar1;
  fVar201 = pfVar1[1];
  fVar195 = pfVar1[2];
  fVar216 = pfVar1[3];
  pfVar1 = (float *)(_Var13 + (uVar71 + 1) * (long)pvVar12);
  fVar196 = *pfVar1;
  fVar218 = pfVar1[1];
  fVar197 = pfVar1[2];
  fVar219 = pfVar1[3];
  pfVar1 = (float *)(_Var13 + (uVar71 + 2) * (long)pvVar12);
  fVar198 = *pfVar1;
  fVar221 = pfVar1[1];
  fVar199 = pfVar1[2];
  fVar222 = pfVar1[3];
  pfVar1 = (float *)(_Var13 + (long)pvVar12 * (uVar71 + 3));
  fVar200 = *pfVar1;
  fVar224 = pfVar1[1];
  fVar150 = pfVar1[2];
  fVar164 = pfVar1[3];
  uVar73 = uVar73 - 1 & uVar73;
  lVar72 = *(long *)&pGVar10[1].time_range.upper;
  pfVar1 = (float *)(lVar72 + (long)p_Var11 * uVar71);
  fVar167 = *pfVar1;
  fVar169 = pfVar1[1];
  fVar172 = pfVar1[2];
  fVar173 = pfVar1[3];
  pfVar1 = (float *)(lVar72 + (long)p_Var11 * (uVar71 + 1));
  fVar174 = *pfVar1;
  fVar165 = pfVar1[1];
  fVar168 = pfVar1[2];
  fVar170 = pfVar1[3];
  pfVar1 = (float *)(lVar72 + (long)p_Var11 * (uVar71 + 2));
  fVar23 = *pfVar1;
  fVar292 = pfVar1[1];
  fVar166 = pfVar1[2];
  fVar293 = pfVar1[3];
  lVar14 = 0;
  if (uVar73 != 0) {
    for (; (uVar73 >> lVar14 & 1) == 0; lVar14 = lVar14 + 1) {
    }
  }
  pfVar1 = (float *)(lVar72 + (long)p_Var11 * (uVar71 + 3));
  fVar171 = *pfVar1;
  fVar294 = pfVar1[1];
  fVar295 = pfVar1[2];
  fVar296 = pfVar1[3];
  if (((uVar73 != 0) && (uVar71 = uVar73 - 1 & uVar73, uVar71 != 0)) && (lVar72 = 0, uVar71 != 0)) {
    for (; (uVar71 >> lVar72 & 1) == 0; lVar72 = lVar72 + 1) {
    }
  }
  auVar96 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x1c);
  auVar191 = vinsertps_avx(auVar96,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
  fVar297 = auVar334._8_4_;
  fVar217 = auVar334._12_4_;
  local_5f8._0_4_ = fVar167 * 0.16666667 + fVar174 * 0.6666667 + fVar23 * 0.16666667 + fVar171 * 0.0
  ;
  local_5f8._4_4_ =
       fVar169 * 0.16666667 + fVar165 * 0.6666667 + fVar292 * 0.16666667 + fVar294 * 0.0;
  fStack_5f0 = fVar172 * 0.16666667 + fVar168 * 0.6666667 + fVar166 * 0.16666667 + fVar295 * fVar297
  ;
  fStack_5ec = fVar173 * 0.16666667 + fVar170 * 0.6666667 + fVar293 * 0.16666667 + fVar296 * fVar217
  ;
  auVar114._0_4_ = fVar23 * 0.5 + fVar171 * 0.0;
  auVar114._4_4_ = fVar292 * 0.5 + fVar294 * 0.0;
  auVar114._8_4_ = fVar166 * 0.5 + fVar295 * fVar297;
  auVar114._12_4_ = fVar293 * 0.5 + fVar296 * fVar217;
  auVar281._0_4_ = fVar174 * 0.0;
  auVar281._4_4_ = fVar165 * 0.0;
  auVar281._8_4_ = fVar297 * fVar168;
  auVar281._12_4_ = fVar217 * fVar170;
  auVar96 = vsubps_avx(auVar114,auVar281);
  auVar282._0_4_ = fVar167 * 0.5;
  auVar282._4_4_ = fVar169 * 0.5;
  auVar282._8_4_ = fVar172 * 0.5;
  auVar282._12_4_ = fVar173 * 0.5;
  auVar138 = vsubps_avx(auVar96,auVar282);
  auVar283._0_4_ = fVar175 * 0.16666667 + fVar196 * 0.6666667 + fVar198 * 0.16666667 + fVar200 * 0.0
  ;
  auVar283._4_4_ = fVar201 * 0.16666667 + fVar218 * 0.6666667 + fVar221 * 0.16666667 + fVar224 * 0.0
  ;
  auVar283._8_4_ =
       fVar195 * 0.16666667 + fVar197 * 0.6666667 + fVar199 * 0.16666667 + fVar297 * fVar150;
  auVar283._12_4_ =
       fVar216 * 0.16666667 + fVar219 * 0.6666667 + fVar222 * 0.16666667 + fVar217 * fVar164;
  auVar299._0_4_ = fVar198 * 0.5 + fVar200 * 0.0;
  auVar299._4_4_ = fVar221 * 0.5 + fVar224 * 0.0;
  auVar299._8_4_ = fVar199 * 0.5 + fVar297 * fVar150;
  auVar299._12_4_ = fVar222 * 0.5 + fVar217 * fVar164;
  auVar314._0_4_ = fVar196 * 0.0;
  auVar314._4_4_ = fVar218 * 0.0;
  auVar314._8_4_ = fVar297 * fVar197;
  auVar314._12_4_ = fVar217 * fVar219;
  auVar96 = vsubps_avx(auVar299,auVar314);
  auVar315._0_4_ = fVar175 * 0.5;
  auVar315._4_4_ = fVar201 * 0.5;
  auVar315._8_4_ = fVar195 * 0.5;
  auVar315._12_4_ = fVar216 * 0.5;
  auVar284 = vsubps_avx(auVar96,auVar315);
  auVar325._0_4_ = fVar167 * 0.0;
  auVar325._4_4_ = fVar169 * 0.0;
  auVar325._8_4_ = fVar297 * fVar172;
  auVar325._12_4_ = fVar217 * fVar173;
  local_5a8._0_4_ =
       auVar325._0_4_ + fVar174 * 0.16666667 + fVar23 * 0.6666667 + fVar171 * 0.16666667;
  local_5a8._4_4_ =
       auVar325._4_4_ + fVar165 * 0.16666667 + fVar292 * 0.6666667 + fVar294 * 0.16666667;
  fStack_5a0 = auVar325._8_4_ + fVar168 * 0.16666667 + fVar166 * 0.6666667 + fVar295 * 0.16666667;
  fStack_59c = auVar325._12_4_ + fVar170 * 0.16666667 + fVar293 * 0.6666667 + fVar296 * 0.16666667;
  auVar251._0_4_ = fVar23 * 0.0 + fVar171 * 0.5;
  auVar251._4_4_ = fVar292 * 0.0 + fVar294 * 0.5;
  auVar251._8_4_ = fVar166 * fVar297 + fVar295 * 0.5;
  auVar251._12_4_ = fVar293 * fVar217 + fVar296 * 0.5;
  auVar151._0_4_ = fVar174 * 0.5;
  auVar151._4_4_ = fVar165 * 0.5;
  auVar151._8_4_ = fVar168 * 0.5;
  auVar151._12_4_ = fVar170 * 0.5;
  auVar96 = vsubps_avx(auVar251,auVar151);
  auVar77 = vsubps_avx(auVar96,auVar325);
  auVar203._0_4_ = fVar175 * 0.0;
  auVar203._4_4_ = fVar201 * 0.0;
  auVar203._8_4_ = fVar297 * fVar195;
  auVar203._12_4_ = fVar217 * fVar216;
  auVar252._0_4_ =
       fVar196 * 0.16666667 + fVar198 * 0.6666667 + fVar200 * 0.16666667 + auVar203._0_4_;
  auVar252._4_4_ =
       fVar218 * 0.16666667 + fVar221 * 0.6666667 + fVar224 * 0.16666667 + auVar203._4_4_;
  auVar252._8_4_ =
       fVar197 * 0.16666667 + fVar199 * 0.6666667 + fVar150 * 0.16666667 + auVar203._8_4_;
  auVar252._12_4_ =
       fVar219 * 0.16666667 + fVar222 * 0.6666667 + fVar164 * 0.16666667 + auVar203._12_4_;
  auVar225._0_4_ = fVar200 * 0.5 + fVar198 * 0.0;
  auVar225._4_4_ = fVar224 * 0.5 + fVar221 * 0.0;
  auVar225._8_4_ = fVar150 * 0.5 + fVar297 * fVar199;
  auVar225._12_4_ = fVar164 * 0.5 + fVar217 * fVar222;
  auVar178._0_4_ = fVar196 * 0.5;
  auVar178._4_4_ = fVar218 * 0.5;
  auVar178._8_4_ = fVar197 * 0.5;
  auVar178._12_4_ = fVar219 * 0.5;
  auVar96 = vsubps_avx(auVar225,auVar178);
  auVar139 = vsubps_avx(auVar96,auVar203);
  auVar96 = vshufps_avx(auVar138,auVar138,0xc9);
  auVar205 = vshufps_avx(auVar283,auVar283,0xc9);
  fVar167 = auVar138._0_4_;
  auVar226._0_4_ = fVar167 * auVar205._0_4_;
  fVar169 = auVar138._4_4_;
  auVar226._4_4_ = fVar169 * auVar205._4_4_;
  fVar172 = auVar138._8_4_;
  auVar226._8_4_ = fVar172 * auVar205._8_4_;
  fVar173 = auVar138._12_4_;
  auVar226._12_4_ = fVar173 * auVar205._12_4_;
  auVar241._0_4_ = auVar283._0_4_ * auVar96._0_4_;
  auVar241._4_4_ = auVar283._4_4_ * auVar96._4_4_;
  auVar241._8_4_ = auVar283._8_4_ * auVar96._8_4_;
  auVar241._12_4_ = auVar283._12_4_ * auVar96._12_4_;
  auVar205 = vsubps_avx(auVar241,auVar226);
  auVar5 = vshufps_avx(auVar205,auVar205,0xc9);
  auVar205 = vshufps_avx(auVar284,auVar284,0xc9);
  auVar227._0_4_ = fVar167 * auVar205._0_4_;
  auVar227._4_4_ = fVar169 * auVar205._4_4_;
  auVar227._8_4_ = fVar172 * auVar205._8_4_;
  auVar227._12_4_ = fVar173 * auVar205._12_4_;
  auVar179._0_4_ = auVar284._0_4_ * auVar96._0_4_;
  auVar179._4_4_ = auVar284._4_4_ * auVar96._4_4_;
  auVar179._8_4_ = auVar284._8_4_ * auVar96._8_4_;
  auVar179._12_4_ = auVar284._12_4_ * auVar96._12_4_;
  auVar96 = vsubps_avx(auVar179,auVar227);
  auVar284 = vshufps_avx(auVar96,auVar96,0xc9);
  auVar96 = vshufps_avx(auVar77,auVar77,0xc9);
  auVar205 = vshufps_avx(auVar252,auVar252,0xc9);
  fVar174 = auVar77._0_4_;
  auVar180._0_4_ = fVar174 * auVar205._0_4_;
  fVar165 = auVar77._4_4_;
  auVar180._4_4_ = fVar165 * auVar205._4_4_;
  fVar168 = auVar77._8_4_;
  auVar180._8_4_ = fVar168 * auVar205._8_4_;
  fVar170 = auVar77._12_4_;
  auVar180._12_4_ = fVar170 * auVar205._12_4_;
  auVar253._0_4_ = auVar252._0_4_ * auVar96._0_4_;
  auVar253._4_4_ = auVar252._4_4_ * auVar96._4_4_;
  auVar253._8_4_ = auVar252._8_4_ * auVar96._8_4_;
  auVar253._12_4_ = auVar252._12_4_ * auVar96._12_4_;
  auVar205 = vsubps_avx(auVar253,auVar180);
  auVar6 = vshufps_avx(auVar205,auVar205,0xc9);
  auVar205 = vshufps_avx(auVar139,auVar139,0xc9);
  auVar254._0_4_ = auVar205._0_4_ * fVar174;
  auVar254._4_4_ = auVar205._4_4_ * fVar165;
  auVar254._8_4_ = auVar205._8_4_ * fVar168;
  auVar254._12_4_ = auVar205._12_4_ * fVar170;
  auVar204._0_4_ = auVar96._0_4_ * auVar139._0_4_;
  auVar204._4_4_ = auVar96._4_4_ * auVar139._4_4_;
  auVar204._8_4_ = auVar96._8_4_ * auVar139._8_4_;
  auVar204._12_4_ = auVar96._12_4_ * auVar139._12_4_;
  auVar96 = vdpps_avx(auVar5,auVar5,0x7f);
  auVar205 = vsubps_avx(auVar204,auVar254);
  auVar139 = vshufps_avx(auVar205,auVar205,0xc9);
  fVar196 = auVar96._0_4_;
  auVar255._4_12_ = auVar334._4_12_;
  auVar255._0_4_ = fVar196;
  auVar205 = vrsqrtss_avx(auVar255,auVar255);
  fVar175 = auVar205._0_4_;
  auVar205 = ZEXT416((uint)(fVar175 * 1.5 - fVar196 * 0.5 * fVar175 * fVar175 * fVar175));
  auVar95 = vshufps_avx(auVar205,auVar205,0);
  fVar175 = auVar5._0_4_ * auVar95._0_4_;
  fVar201 = auVar5._4_4_ * auVar95._4_4_;
  fVar195 = auVar5._8_4_ * auVar95._8_4_;
  fVar216 = auVar5._12_4_ * auVar95._12_4_;
  auVar205 = vdpps_avx(auVar5,auVar284,0x7f);
  auVar96 = vshufps_avx(auVar96,auVar96,0);
  auVar270._0_4_ = auVar284._0_4_ * auVar96._0_4_;
  auVar270._4_4_ = auVar284._4_4_ * auVar96._4_4_;
  auVar270._8_4_ = auVar284._8_4_ * auVar96._8_4_;
  auVar270._12_4_ = auVar284._12_4_ * auVar96._12_4_;
  auVar96 = vshufps_avx(auVar205,auVar205,0);
  auVar242._0_4_ = auVar5._0_4_ * auVar96._0_4_;
  auVar242._4_4_ = auVar5._4_4_ * auVar96._4_4_;
  auVar242._8_4_ = auVar5._8_4_ * auVar96._8_4_;
  auVar242._12_4_ = auVar5._12_4_ * auVar96._12_4_;
  auVar118 = vsubps_avx(auVar270,auVar242);
  auVar96 = vrcpss_avx(auVar255,auVar255);
  auVar96 = ZEXT416((uint)(auVar96._0_4_ * (2.0 - fVar196 * auVar96._0_4_)));
  auVar5 = vshufps_avx(auVar96,auVar96,0);
  auVar96 = vdpps_avx(auVar6,auVar6,0x7f);
  fVar196 = auVar96._0_4_;
  auVar271._4_12_ = auVar334._4_12_;
  auVar271._0_4_ = fVar196;
  auVar205 = vrsqrtss_avx(auVar271,auVar271);
  fVar218 = auVar205._0_4_;
  auVar205 = vdpps_avx(auVar6,auVar139,0x7f);
  auVar284 = ZEXT416((uint)(fVar218 * 1.5 - fVar196 * 0.5 * fVar218 * fVar218 * fVar218));
  auVar284 = vshufps_avx(auVar284,auVar284,0);
  fVar218 = auVar284._0_4_ * auVar6._0_4_;
  fVar197 = auVar284._4_4_ * auVar6._4_4_;
  fVar219 = auVar284._8_4_ * auVar6._8_4_;
  fVar198 = auVar284._12_4_ * auVar6._12_4_;
  auVar96 = vshufps_avx(auVar96,auVar96,0);
  auVar228._0_4_ = auVar96._0_4_ * auVar139._0_4_;
  auVar228._4_4_ = auVar96._4_4_ * auVar139._4_4_;
  auVar228._8_4_ = auVar96._8_4_ * auVar139._8_4_;
  auVar228._12_4_ = auVar96._12_4_ * auVar139._12_4_;
  auVar96 = vshufps_avx(auVar205,auVar205,0);
  auVar181._0_4_ = auVar96._0_4_ * auVar6._0_4_;
  auVar181._4_4_ = auVar96._4_4_ * auVar6._4_4_;
  auVar181._8_4_ = auVar96._8_4_ * auVar6._8_4_;
  auVar181._12_4_ = auVar96._12_4_ * auVar6._12_4_;
  auVar139 = vsubps_avx(auVar228,auVar181);
  auVar96 = vrcpss_avx(auVar271,auVar271);
  auVar96 = ZEXT416((uint)((2.0 - fVar196 * auVar96._0_4_) * auVar96._0_4_));
  auVar96 = vshufps_avx(auVar96,auVar96,0);
  auVar205 = vshufps_avx(_local_5f8,_local_5f8,0xff);
  auVar256._0_4_ = auVar205._0_4_ * fVar175;
  auVar256._4_4_ = auVar205._4_4_ * fVar201;
  auVar256._8_4_ = auVar205._8_4_ * fVar195;
  auVar256._12_4_ = auVar205._12_4_ * fVar216;
  _local_3c8 = vsubps_avx(_local_5f8,auVar256);
  auVar6 = vshufps_avx(auVar138,auVar138,0xff);
  auVar206._0_4_ =
       auVar6._0_4_ * fVar175 + auVar95._0_4_ * auVar118._0_4_ * auVar5._0_4_ * auVar205._0_4_;
  auVar206._4_4_ =
       auVar6._4_4_ * fVar201 + auVar95._4_4_ * auVar118._4_4_ * auVar5._4_4_ * auVar205._4_4_;
  auVar206._8_4_ =
       auVar6._8_4_ * fVar195 + auVar95._8_4_ * auVar118._8_4_ * auVar5._8_4_ * auVar205._8_4_;
  auVar206._12_4_ =
       auVar6._12_4_ * fVar216 + auVar95._12_4_ * auVar118._12_4_ * auVar5._12_4_ * auVar205._12_4_;
  auVar6 = vsubps_avx(auVar138,auVar206);
  local_3d8._0_4_ = auVar256._0_4_ + (float)local_5f8._0_4_;
  local_3d8._4_4_ = auVar256._4_4_ + (float)local_5f8._4_4_;
  fStack_3d0 = auVar256._8_4_ + fStack_5f0;
  fStack_3cc = auVar256._12_4_ + fStack_5ec;
  auVar205 = vshufps_avx(_local_5a8,_local_5a8,0xff);
  auVar115._0_4_ = fVar218 * auVar205._0_4_;
  auVar115._4_4_ = fVar197 * auVar205._4_4_;
  auVar115._8_4_ = fVar219 * auVar205._8_4_;
  auVar115._12_4_ = fVar198 * auVar205._12_4_;
  _local_3e8 = vsubps_avx(_local_5a8,auVar115);
  auVar5 = vshufps_avx(auVar77,auVar77,0xff);
  auVar89._0_4_ =
       fVar218 * auVar5._0_4_ + auVar205._0_4_ * auVar284._0_4_ * auVar139._0_4_ * auVar96._0_4_;
  auVar89._4_4_ =
       fVar197 * auVar5._4_4_ + auVar205._4_4_ * auVar284._4_4_ * auVar139._4_4_ * auVar96._4_4_;
  auVar89._8_4_ =
       fVar219 * auVar5._8_4_ + auVar205._8_4_ * auVar284._8_4_ * auVar139._8_4_ * auVar96._8_4_;
  auVar89._12_4_ =
       fVar198 * auVar5._12_4_ +
       auVar205._12_4_ * auVar284._12_4_ * auVar139._12_4_ * auVar96._12_4_;
  auVar284 = vsubps_avx(auVar77,auVar89);
  local_3f8._0_4_ = (float)local_5a8._0_4_ + auVar115._0_4_;
  local_3f8._4_4_ = (float)local_5a8._4_4_ + auVar115._4_4_;
  fStack_3f0 = fStack_5a0 + auVar115._8_4_;
  fStack_3ec = fStack_59c + auVar115._12_4_;
  local_408._0_4_ = local_3c8._0_4_ + auVar6._0_4_ * 0.33333334;
  local_408._4_4_ = local_3c8._4_4_ + auVar6._4_4_ * 0.33333334;
  fStack_400 = local_3c8._8_4_ + auVar6._8_4_ * 0.33333334;
  fStack_3fc = local_3c8._12_4_ + auVar6._12_4_ * 0.33333334;
  local_288 = vsubps_avx(_local_3c8,auVar191);
  auVar205 = vmovsldup_avx(local_288);
  auVar96 = vmovshdup_avx(local_288);
  auVar5 = vshufps_avx(local_288,local_288,0xaa);
  fVar175 = pre->ray_space[k].vx.field_0.m128[0];
  fVar201 = pre->ray_space[k].vx.field_0.m128[1];
  fVar195 = pre->ray_space[k].vx.field_0.m128[2];
  fVar216 = pre->ray_space[k].vx.field_0.m128[3];
  fVar196 = pre->ray_space[k].vy.field_0.m128[0];
  fVar218 = pre->ray_space[k].vy.field_0.m128[1];
  fVar197 = pre->ray_space[k].vy.field_0.m128[2];
  fVar219 = pre->ray_space[k].vy.field_0.m128[3];
  fVar198 = pre->ray_space[k].vz.field_0.m128[0];
  fVar221 = pre->ray_space[k].vz.field_0.m128[1];
  fVar199 = pre->ray_space[k].vz.field_0.m128[2];
  fVar222 = pre->ray_space[k].vz.field_0.m128[3];
  fVar200 = fVar175 * auVar205._0_4_ + auVar5._0_4_ * fVar198 + fVar196 * auVar96._0_4_;
  fVar150 = fVar201 * auVar205._4_4_ + auVar5._4_4_ * fVar221 + fVar218 * auVar96._4_4_;
  local_5f8._4_4_ = fVar150;
  local_5f8._0_4_ = fVar200;
  fStack_5f0 = fVar195 * auVar205._8_4_ + auVar5._8_4_ * fVar199 + fVar197 * auVar96._8_4_;
  fStack_5ec = fVar216 * auVar205._12_4_ + auVar5._12_4_ * fVar222 + fVar219 * auVar96._12_4_;
  local_298 = vsubps_avx(_local_408,auVar191);
  auVar5 = vshufps_avx(local_298,local_298,0xaa);
  auVar96 = vmovshdup_avx(local_298);
  auVar205 = vmovsldup_avx(local_298);
  fVar224 = auVar205._0_4_ * fVar175 + auVar96._0_4_ * fVar196 + fVar198 * auVar5._0_4_;
  fVar164 = auVar205._4_4_ * fVar201 + auVar96._4_4_ * fVar218 + fVar221 * auVar5._4_4_;
  local_5c8._4_4_ = fVar164;
  local_5c8._0_4_ = fVar224;
  fStack_5c0 = auVar205._8_4_ * fVar195 + auVar96._8_4_ * fVar197 + fVar199 * auVar5._8_4_;
  fStack_5bc = auVar205._12_4_ * fVar216 + auVar96._12_4_ * fVar219 + fVar222 * auVar5._12_4_;
  auVar182._0_4_ = auVar284._0_4_ * 0.33333334;
  auVar182._4_4_ = auVar284._4_4_ * 0.33333334;
  auVar182._8_4_ = auVar284._8_4_ * 0.33333334;
  auVar182._12_4_ = auVar284._12_4_ * 0.33333334;
  _local_418 = vsubps_avx(_local_3e8,auVar182);
  local_2a8 = vsubps_avx(_local_418,auVar191);
  auVar5 = vshufps_avx(local_2a8,local_2a8,0xaa);
  auVar96 = vmovshdup_avx(local_2a8);
  auVar205 = vmovsldup_avx(local_2a8);
  auVar316._0_4_ = auVar205._0_4_ * fVar175 + auVar96._0_4_ * fVar196 + fVar198 * auVar5._0_4_;
  auVar316._4_4_ = auVar205._4_4_ * fVar201 + auVar96._4_4_ * fVar218 + fVar221 * auVar5._4_4_;
  auVar316._8_4_ = auVar205._8_4_ * fVar195 + auVar96._8_4_ * fVar197 + fVar199 * auVar5._8_4_;
  auVar316._12_4_ = auVar205._12_4_ * fVar216 + auVar96._12_4_ * fVar219 + fVar222 * auVar5._12_4_;
  local_2b8 = vsubps_avx(_local_3e8,auVar191);
  auVar5 = vshufps_avx(local_2b8,local_2b8,0xaa);
  auVar96 = vmovshdup_avx(local_2b8);
  auVar205 = vmovsldup_avx(local_2b8);
  auVar300._0_4_ = auVar205._0_4_ * fVar175 + auVar96._0_4_ * fVar196 + auVar5._0_4_ * fVar198;
  auVar300._4_4_ = auVar205._4_4_ * fVar201 + auVar96._4_4_ * fVar218 + auVar5._4_4_ * fVar221;
  auVar300._8_4_ = auVar205._8_4_ * fVar195 + auVar96._8_4_ * fVar197 + auVar5._8_4_ * fVar199;
  auVar300._12_4_ = auVar205._12_4_ * fVar216 + auVar96._12_4_ * fVar219 + auVar5._12_4_ * fVar222;
  local_2c8 = vsubps_avx(_local_3d8,auVar191);
  auVar5 = vshufps_avx(local_2c8,local_2c8,0xaa);
  auVar96 = vmovshdup_avx(local_2c8);
  auVar205 = vmovsldup_avx(local_2c8);
  auVar272._0_4_ = auVar205._0_4_ * fVar175 + auVar96._0_4_ * fVar196 + auVar5._0_4_ * fVar198;
  auVar272._4_4_ = auVar205._4_4_ * fVar201 + auVar96._4_4_ * fVar218 + auVar5._4_4_ * fVar221;
  auVar272._8_4_ = auVar205._8_4_ * fVar195 + auVar96._8_4_ * fVar197 + auVar5._8_4_ * fVar199;
  auVar272._12_4_ = auVar205._12_4_ * fVar216 + auVar96._12_4_ * fVar219 + auVar5._12_4_ * fVar222;
  local_428._0_4_ = (float)local_3d8._0_4_ + (fVar167 + auVar206._0_4_) * 0.33333334;
  local_428._4_4_ = (float)local_3d8._4_4_ + (fVar169 + auVar206._4_4_) * 0.33333334;
  fStack_420 = fStack_3d0 + (fVar172 + auVar206._8_4_) * 0.33333334;
  fStack_41c = fStack_3cc + (fVar173 + auVar206._12_4_) * 0.33333334;
  local_2d8 = vsubps_avx(_local_428,auVar191);
  auVar5 = vshufps_avx(local_2d8,local_2d8,0xaa);
  auVar96 = vmovshdup_avx(local_2d8);
  auVar205 = vmovsldup_avx(local_2d8);
  auVar257._0_4_ = auVar205._0_4_ * fVar175 + auVar96._0_4_ * fVar196 + auVar5._0_4_ * fVar198;
  auVar257._4_4_ = auVar205._4_4_ * fVar201 + auVar96._4_4_ * fVar218 + auVar5._4_4_ * fVar221;
  auVar257._8_4_ = auVar205._8_4_ * fVar195 + auVar96._8_4_ * fVar197 + auVar5._8_4_ * fVar199;
  auVar257._12_4_ = auVar205._12_4_ * fVar216 + auVar96._12_4_ * fVar219 + auVar5._12_4_ * fVar222;
  auVar229._0_4_ = (fVar174 + auVar89._0_4_) * 0.33333334;
  auVar229._4_4_ = (fVar165 + auVar89._4_4_) * 0.33333334;
  auVar229._8_4_ = (fVar168 + auVar89._8_4_) * 0.33333334;
  auVar229._12_4_ = (fVar170 + auVar89._12_4_) * 0.33333334;
  _local_318 = vsubps_avx(_local_3f8,auVar229);
  local_2e8 = vsubps_avx(_local_318,auVar191);
  auVar5 = vshufps_avx(local_2e8,local_2e8,0xaa);
  auVar96 = vmovshdup_avx(local_2e8);
  auVar205 = vmovsldup_avx(local_2e8);
  auVar90._0_4_ = auVar205._0_4_ * fVar175 + auVar96._0_4_ * fVar196 + fVar198 * auVar5._0_4_;
  auVar90._4_4_ = auVar205._4_4_ * fVar201 + auVar96._4_4_ * fVar218 + fVar221 * auVar5._4_4_;
  auVar90._8_4_ = auVar205._8_4_ * fVar195 + auVar96._8_4_ * fVar197 + fVar199 * auVar5._8_4_;
  auVar90._12_4_ = auVar205._12_4_ * fVar216 + auVar96._12_4_ * fVar219 + fVar222 * auVar5._12_4_;
  local_2f8 = vsubps_avx(_local_3f8,auVar191);
  auVar191 = vshufps_avx(local_2f8,local_2f8,0xaa);
  auVar96 = vmovshdup_avx(local_2f8);
  auVar205 = vmovsldup_avx(local_2f8);
  auVar75._0_4_ = fVar175 * auVar205._0_4_ + fVar196 * auVar96._0_4_ + fVar198 * auVar191._0_4_;
  auVar75._4_4_ = fVar201 * auVar205._4_4_ + fVar218 * auVar96._4_4_ + fVar221 * auVar191._4_4_;
  auVar75._8_4_ = fVar195 * auVar205._8_4_ + fVar197 * auVar96._8_4_ + fVar199 * auVar191._8_4_;
  auVar75._12_4_ = fVar216 * auVar205._12_4_ + fVar219 * auVar96._12_4_ + fVar222 * auVar191._12_4_;
  auVar5 = vmovlhps_avx(_local_5f8,auVar272);
  auVar284 = vmovlhps_avx(_local_5c8,auVar257);
  auVar6 = vmovlhps_avx(auVar316,auVar90);
  _local_3b8 = vmovlhps_avx(auVar300,auVar75);
  auVar96 = vminps_avx(auVar5,auVar284);
  auVar205 = vminps_avx(auVar6,_local_3b8);
  auVar191 = vminps_avx(auVar96,auVar205);
  auVar96 = vmaxps_avx(auVar5,auVar284);
  auVar205 = vmaxps_avx(auVar6,_local_3b8);
  auVar96 = vmaxps_avx(auVar96,auVar205);
  auVar205 = vshufpd_avx(auVar191,auVar191,3);
  auVar191 = vminps_avx(auVar191,auVar205);
  auVar205 = vshufpd_avx(auVar96,auVar96,3);
  auVar205 = vmaxps_avx(auVar96,auVar205);
  auVar207._8_4_ = 0x7fffffff;
  auVar207._0_8_ = 0x7fffffff7fffffff;
  auVar207._12_4_ = 0x7fffffff;
  auVar96 = vandps_avx(auVar191,auVar207);
  auVar205 = vandps_avx(auVar205,auVar207);
  auVar96 = vmaxps_avx(auVar96,auVar205);
  auVar205 = vmovshdup_avx(auVar96);
  auVar96 = vmaxss_avx(auVar205,auVar96);
  fVar201 = auVar96._0_4_ * 9.536743e-07;
  auVar96 = vshufps_avx(ZEXT416((uint)fVar201),ZEXT416((uint)fVar201),0);
  local_138._16_16_ = auVar96;
  local_138._0_16_ = auVar96;
  auVar76._0_8_ = auVar96._0_8_ ^ 0x8000000080000000;
  auVar76._8_4_ = auVar96._8_4_ ^ 0x80000000;
  auVar76._12_4_ = auVar96._12_4_ ^ 0x80000000;
  local_158._16_16_ = auVar76;
  local_158._0_16_ = auVar76;
  local_368 = vshufps_avx(ZEXT416(uVar67),ZEXT416(uVar67),0);
  local_378 = vshufps_avx(ZEXT416(uVar9),ZEXT416(uVar9),0);
  uVar71 = 0;
  fVar175 = *(float *)(ray + k * 4 + 0x30);
  _local_258 = vsubps_avx(auVar284,auVar5);
  _local_268 = vsubps_avx(auVar6,auVar284);
  _local_278 = vsubps_avx(_local_3b8,auVar6);
  _local_328 = vsubps_avx(_local_3d8,_local_3c8);
  _local_338 = vsubps_avx(_local_428,_local_408);
  _local_348 = vsubps_avx(_local_318,_local_418);
  _local_358 = vsubps_avx(_local_3f8,_local_3e8);
  _local_5f8 = ZEXT816(0x3f80000000000000);
  local_308 = _local_5f8;
  do {
    auVar96 = vshufps_avx(_local_5f8,_local_5f8,0x50);
    auVar330._8_4_ = 0x3f800000;
    auVar330._0_8_ = &DAT_3f8000003f800000;
    auVar330._12_4_ = 0x3f800000;
    auVar333._16_4_ = 0x3f800000;
    auVar333._0_16_ = auVar330;
    auVar333._20_4_ = 0x3f800000;
    auVar333._24_4_ = 0x3f800000;
    auVar333._28_4_ = 0x3f800000;
    auVar205 = vsubps_avx(auVar330,auVar96);
    fVar195 = auVar96._0_4_;
    fVar216 = auVar96._4_4_;
    fVar196 = auVar96._8_4_;
    fVar218 = auVar96._12_4_;
    fVar197 = auVar205._0_4_;
    fVar219 = auVar205._4_4_;
    fVar198 = auVar205._8_4_;
    fVar221 = auVar205._12_4_;
    auVar116._0_4_ = auVar272._0_4_ * fVar195 + fVar197 * fVar200;
    auVar116._4_4_ = auVar272._4_4_ * fVar216 + fVar219 * fVar150;
    auVar116._8_4_ = auVar272._0_4_ * fVar196 + fVar198 * fVar200;
    auVar116._12_4_ = auVar272._4_4_ * fVar218 + fVar221 * fVar150;
    auVar91._0_4_ = auVar257._0_4_ * fVar195 + fVar224 * fVar197;
    auVar91._4_4_ = auVar257._4_4_ * fVar216 + fVar164 * fVar219;
    auVar91._8_4_ = auVar257._0_4_ * fVar196 + fVar224 * fVar198;
    auVar91._12_4_ = auVar257._4_4_ * fVar218 + fVar164 * fVar221;
    auVar230._0_4_ = auVar90._0_4_ * fVar195 + auVar316._0_4_ * fVar197;
    auVar230._4_4_ = auVar90._4_4_ * fVar216 + auVar316._4_4_ * fVar219;
    auVar230._8_4_ = auVar90._0_4_ * fVar196 + auVar316._0_4_ * fVar198;
    auVar230._12_4_ = auVar90._4_4_ * fVar218 + auVar316._4_4_ * fVar221;
    auVar130._0_4_ = auVar75._0_4_ * fVar195 + auVar300._0_4_ * fVar197;
    auVar130._4_4_ = auVar75._4_4_ * fVar216 + auVar300._4_4_ * fVar219;
    auVar130._8_4_ = auVar75._0_4_ * fVar196 + auVar300._0_4_ * fVar198;
    auVar130._12_4_ = auVar75._4_4_ * fVar218 + auVar300._4_4_ * fVar221;
    auVar96 = vmovshdup_avx(local_308);
    auVar205 = vshufps_avx(local_308,local_308,0);
    auVar249._16_16_ = auVar205;
    auVar249._0_16_ = auVar205;
    auVar191 = vshufps_avx(local_308,local_308,0x55);
    auVar83._16_16_ = auVar191;
    auVar83._0_16_ = auVar191;
    auVar79 = vsubps_avx(auVar83,auVar249);
    auVar191 = vshufps_avx(auVar116,auVar116,0);
    auVar139 = vshufps_avx(auVar116,auVar116,0x55);
    auVar95 = vshufps_avx(auVar91,auVar91,0);
    auVar138 = vshufps_avx(auVar91,auVar91,0x55);
    auVar77 = vshufps_avx(auVar230,auVar230,0);
    auVar118 = vshufps_avx(auVar230,auVar230,0x55);
    auVar7 = vshufps_avx(auVar130,auVar130,0);
    auVar74 = vshufps_avx(auVar130,auVar130,0x55);
    auVar96 = ZEXT416((uint)((auVar96._0_4_ - local_308._0_4_) * 0.04761905));
    auVar96 = vshufps_avx(auVar96,auVar96,0);
    auVar269._0_4_ = auVar205._0_4_ + auVar79._0_4_ * 0.0;
    auVar269._4_4_ = auVar205._4_4_ + auVar79._4_4_ * 0.14285715;
    auVar269._8_4_ = auVar205._8_4_ + auVar79._8_4_ * 0.2857143;
    auVar269._12_4_ = auVar205._12_4_ + auVar79._12_4_ * 0.42857146;
    auVar269._16_4_ = auVar205._0_4_ + auVar79._16_4_ * 0.5714286;
    auVar269._20_4_ = auVar205._4_4_ + auVar79._20_4_ * 0.71428573;
    auVar269._24_4_ = auVar205._8_4_ + auVar79._24_4_ * 0.8571429;
    auVar269._28_4_ = auVar205._12_4_ + auVar79._28_4_;
    auVar16 = vsubps_avx(auVar333,auVar269);
    fVar173 = auVar95._0_4_;
    fVar165 = auVar95._4_4_;
    fVar166 = auVar95._8_4_;
    fVar171 = auVar95._12_4_;
    fVar195 = auVar16._0_4_;
    fVar197 = auVar16._4_4_;
    fVar199 = auVar16._8_4_;
    fVar172 = auVar16._12_4_;
    fVar322 = auVar191._12_4_;
    fVar168 = auVar16._16_4_;
    fVar170 = auVar16._20_4_;
    fVar23 = auVar16._24_4_;
    fVar217 = auVar138._0_4_;
    fVar220 = auVar138._4_4_;
    fVar223 = auVar138._8_4_;
    fVar313 = auVar138._12_4_;
    local_5a8._0_4_ = auVar139._0_4_;
    local_5a8._4_4_ = auVar139._4_4_;
    fStack_5a0 = auVar139._8_4_;
    fStack_59c = auVar139._12_4_;
    fVar216 = auVar77._0_4_;
    fVar218 = auVar77._4_4_;
    fVar198 = auVar77._8_4_;
    fVar222 = auVar77._12_4_;
    fVar174 = auVar269._0_4_ * fVar216 + fVar173 * fVar195;
    fVar292 = auVar269._4_4_ * fVar218 + fVar165 * fVar197;
    fVar293 = auVar269._8_4_ * fVar198 + fVar166 * fVar199;
    fVar294 = auVar269._12_4_ * fVar222 + fVar171 * fVar172;
    fVar295 = auVar269._16_4_ * fVar216 + fVar173 * fVar168;
    fVar296 = auVar269._20_4_ * fVar218 + fVar165 * fVar170;
    fVar297 = auVar269._24_4_ * fVar198 + fVar166 * fVar23;
    fVar196 = auVar118._0_4_;
    fVar219 = auVar118._4_4_;
    fVar221 = auVar118._8_4_;
    fVar167 = auVar118._12_4_;
    fVar298 = auVar269._0_4_ * fVar196 + fVar217 * fVar195;
    fVar304 = auVar269._4_4_ * fVar219 + fVar220 * fVar197;
    fVar305 = auVar269._8_4_ * fVar221 + fVar223 * fVar199;
    fVar306 = auVar269._12_4_ * fVar167 + fVar313 * fVar172;
    fVar307 = auVar269._16_4_ * fVar196 + fVar217 * fVar168;
    fVar309 = auVar269._20_4_ * fVar219 + fVar220 * fVar170;
    fVar311 = auVar269._24_4_ * fVar221 + fVar223 * fVar23;
    auVar205 = vshufps_avx(auVar116,auVar116,0xaa);
    auVar139 = vshufps_avx(auVar116,auVar116,0xff);
    fVar169 = fVar222 + 0.0;
    auVar95 = vshufps_avx(auVar91,auVar91,0xaa);
    auVar138 = vshufps_avx(auVar91,auVar91,0xff);
    auVar84._0_4_ =
         fVar195 * (fVar173 * auVar269._0_4_ + auVar191._0_4_ * fVar195) + auVar269._0_4_ * fVar174;
    auVar84._4_4_ =
         fVar197 * (fVar165 * auVar269._4_4_ + auVar191._4_4_ * fVar197) + auVar269._4_4_ * fVar292;
    auVar84._8_4_ =
         fVar199 * (fVar166 * auVar269._8_4_ + auVar191._8_4_ * fVar199) + auVar269._8_4_ * fVar293;
    auVar84._12_4_ =
         fVar172 * (fVar171 * auVar269._12_4_ + fVar322 * fVar172) + auVar269._12_4_ * fVar294;
    auVar84._16_4_ =
         fVar168 * (fVar173 * auVar269._16_4_ + auVar191._0_4_ * fVar168) +
         auVar269._16_4_ * fVar295;
    auVar84._20_4_ =
         fVar170 * (fVar165 * auVar269._20_4_ + auVar191._4_4_ * fVar170) +
         auVar269._20_4_ * fVar296;
    auVar84._24_4_ =
         fVar23 * (fVar166 * auVar269._24_4_ + auVar191._8_4_ * fVar23) + auVar269._24_4_ * fVar297;
    auVar84._28_4_ = fVar322 + 1.0 + fVar167;
    auVar146._0_4_ =
         fVar195 * (fVar217 * auVar269._0_4_ + fVar195 * (float)local_5a8._0_4_) +
         auVar269._0_4_ * fVar298;
    auVar146._4_4_ =
         fVar197 * (fVar220 * auVar269._4_4_ + fVar197 * (float)local_5a8._4_4_) +
         auVar269._4_4_ * fVar304;
    auVar146._8_4_ =
         fVar199 * (fVar223 * auVar269._8_4_ + fVar199 * fStack_5a0) + auVar269._8_4_ * fVar305;
    auVar146._12_4_ =
         fVar172 * (fVar313 * auVar269._12_4_ + fVar172 * fStack_59c) + auVar269._12_4_ * fVar306;
    auVar146._16_4_ =
         fVar168 * (fVar217 * auVar269._16_4_ + fVar168 * (float)local_5a8._0_4_) +
         auVar269._16_4_ * fVar307;
    auVar146._20_4_ =
         fVar170 * (fVar220 * auVar269._20_4_ + fVar170 * (float)local_5a8._4_4_) +
         auVar269._20_4_ * fVar309;
    auVar146._24_4_ =
         fVar23 * (fVar223 * auVar269._24_4_ + fVar23 * fStack_5a0) + auVar269._24_4_ * fVar311;
    auVar146._28_4_ = fVar322 + 1.0 + fVar167;
    auVar161._0_4_ =
         fVar195 * fVar174 + auVar269._0_4_ * (auVar7._0_4_ * auVar269._0_4_ + fVar195 * fVar216);
    auVar161._4_4_ =
         fVar197 * fVar292 + auVar269._4_4_ * (auVar7._4_4_ * auVar269._4_4_ + fVar197 * fVar218);
    auVar161._8_4_ =
         fVar199 * fVar293 + auVar269._8_4_ * (auVar7._8_4_ * auVar269._8_4_ + fVar199 * fVar198);
    auVar161._12_4_ =
         fVar172 * fVar294 + auVar269._12_4_ * (auVar7._12_4_ * auVar269._12_4_ + fVar172 * fVar222)
    ;
    auVar161._16_4_ =
         fVar168 * fVar295 + auVar269._16_4_ * (auVar7._0_4_ * auVar269._16_4_ + fVar168 * fVar216);
    auVar161._20_4_ =
         fVar170 * fVar296 + auVar269._20_4_ * (auVar7._4_4_ * auVar269._20_4_ + fVar170 * fVar218);
    auVar161._24_4_ =
         fVar23 * fVar297 + auVar269._24_4_ * (auVar7._8_4_ * auVar269._24_4_ + fVar23 * fVar198);
    auVar161._28_4_ = fVar167 + fVar169;
    auVar280._0_4_ =
         fVar195 * fVar298 + auVar269._0_4_ * (auVar74._0_4_ * auVar269._0_4_ + fVar195 * fVar196);
    auVar280._4_4_ =
         fVar197 * fVar304 + auVar269._4_4_ * (auVar74._4_4_ * auVar269._4_4_ + fVar197 * fVar219);
    auVar280._8_4_ =
         fVar199 * fVar305 + auVar269._8_4_ * (auVar74._8_4_ * auVar269._8_4_ + fVar199 * fVar221);
    auVar280._12_4_ =
         fVar172 * fVar306 +
         auVar269._12_4_ * (auVar74._12_4_ * auVar269._12_4_ + fVar172 * fVar167);
    auVar280._16_4_ =
         fVar168 * fVar307 + auVar269._16_4_ * (auVar74._0_4_ * auVar269._16_4_ + fVar168 * fVar196)
    ;
    auVar280._20_4_ =
         fVar170 * fVar309 + auVar269._20_4_ * (auVar74._4_4_ * auVar269._20_4_ + fVar170 * fVar219)
    ;
    auVar280._24_4_ =
         fVar23 * fVar311 + auVar269._24_4_ * (auVar74._8_4_ * auVar269._24_4_ + fVar23 * fVar221);
    auVar280._28_4_ = fVar169 + fVar167 + 0.0;
    local_78._0_4_ = fVar195 * auVar84._0_4_ + auVar269._0_4_ * auVar161._0_4_;
    local_78._4_4_ = fVar197 * auVar84._4_4_ + auVar269._4_4_ * auVar161._4_4_;
    local_78._8_4_ = fVar199 * auVar84._8_4_ + auVar269._8_4_ * auVar161._8_4_;
    local_78._12_4_ = fVar172 * auVar84._12_4_ + auVar269._12_4_ * auVar161._12_4_;
    local_78._16_4_ = fVar168 * auVar84._16_4_ + auVar269._16_4_ * auVar161._16_4_;
    local_78._20_4_ = fVar170 * auVar84._20_4_ + auVar269._20_4_ * auVar161._20_4_;
    local_78._24_4_ = fVar23 * auVar84._24_4_ + auVar269._24_4_ * auVar161._24_4_;
    local_78._28_4_ = fVar322 + fVar171 + fVar167 + 0.0;
    local_98._0_4_ = fVar195 * auVar146._0_4_ + auVar269._0_4_ * auVar280._0_4_;
    local_98._4_4_ = fVar197 * auVar146._4_4_ + auVar269._4_4_ * auVar280._4_4_;
    local_98._8_4_ = fVar199 * auVar146._8_4_ + auVar269._8_4_ * auVar280._8_4_;
    local_98._12_4_ = fVar172 * auVar146._12_4_ + auVar269._12_4_ * auVar280._12_4_;
    local_98._16_4_ = fVar168 * auVar146._16_4_ + auVar269._16_4_ * auVar280._16_4_;
    local_98._20_4_ = fVar170 * auVar146._20_4_ + auVar269._20_4_ * auVar280._20_4_;
    local_98._24_4_ = fVar23 * auVar146._24_4_ + auVar269._24_4_ * auVar280._24_4_;
    local_98._28_4_ = fVar322 + fVar171 + fVar169;
    auVar17 = vsubps_avx(auVar161,auVar84);
    auVar79 = vsubps_avx(auVar280,auVar146);
    local_578 = auVar96._0_4_;
    fStack_574 = auVar96._4_4_;
    fStack_570 = auVar96._8_4_;
    fStack_56c = auVar96._12_4_;
    local_d8 = local_578 * auVar17._0_4_ * 3.0;
    fStack_d4 = fStack_574 * auVar17._4_4_ * 3.0;
    auVar26._4_4_ = fStack_d4;
    auVar26._0_4_ = local_d8;
    fStack_d0 = fStack_570 * auVar17._8_4_ * 3.0;
    auVar26._8_4_ = fStack_d0;
    fStack_cc = fStack_56c * auVar17._12_4_ * 3.0;
    auVar26._12_4_ = fStack_cc;
    fStack_c8 = local_578 * auVar17._16_4_ * 3.0;
    auVar26._16_4_ = fStack_c8;
    fStack_c4 = fStack_574 * auVar17._20_4_ * 3.0;
    auVar26._20_4_ = fStack_c4;
    fStack_c0 = fStack_570 * auVar17._24_4_ * 3.0;
    auVar26._24_4_ = fStack_c0;
    auVar26._28_4_ = auVar17._28_4_;
    fVar292 = local_578 * auVar79._0_4_ * 3.0;
    fVar166 = fStack_574 * auVar79._4_4_ * 3.0;
    auVar27._4_4_ = fVar166;
    auVar27._0_4_ = fVar292;
    fVar293 = fStack_570 * auVar79._8_4_ * 3.0;
    auVar27._8_4_ = fVar293;
    fVar171 = fStack_56c * auVar79._12_4_ * 3.0;
    auVar27._12_4_ = fVar171;
    fVar294 = local_578 * auVar79._16_4_ * 3.0;
    auVar27._16_4_ = fVar294;
    fVar295 = fStack_574 * auVar79._20_4_ * 3.0;
    auVar27._20_4_ = fVar295;
    fVar296 = fStack_570 * auVar79._24_4_ * 3.0;
    auVar27._24_4_ = fVar296;
    auVar27._28_4_ = auVar161._28_4_;
    auVar15 = vsubps_avx(local_78,auVar26);
    auVar79 = vperm2f128_avx(auVar15,auVar15,1);
    auVar79 = vshufps_avx(auVar79,auVar15,0x30);
    auVar79 = vshufps_avx(auVar15,auVar79,0x29);
    auVar18 = vsubps_avx(local_98,auVar27);
    auVar15 = vperm2f128_avx(auVar18,auVar18,1);
    auVar15 = vshufps_avx(auVar15,auVar18,0x30);
    auVar19 = vshufps_avx(auVar18,auVar15,0x29);
    fVar324 = auVar95._0_4_;
    fVar328 = auVar95._4_4_;
    fVar329 = auVar95._8_4_;
    fVar216 = auVar138._0_4_;
    fVar219 = auVar138._4_4_;
    fVar222 = auVar138._8_4_;
    fVar173 = auVar138._12_4_;
    fVar323 = auVar139._12_4_;
    auVar96 = vshufps_avx(auVar230,auVar230,0xaa);
    fVar196 = auVar96._0_4_;
    fVar198 = auVar96._4_4_;
    fVar167 = auVar96._8_4_;
    fVar174 = auVar96._12_4_;
    fVar306 = auVar269._0_4_ * fVar196 + fVar324 * fVar195;
    fVar307 = auVar269._4_4_ * fVar198 + fVar328 * fVar197;
    fVar309 = auVar269._8_4_ * fVar167 + fVar329 * fVar199;
    fVar311 = auVar269._12_4_ * fVar174 + auVar95._12_4_ * fVar172;
    fVar308 = auVar269._16_4_ * fVar196 + fVar324 * fVar168;
    fVar310 = auVar269._20_4_ * fVar198 + fVar328 * fVar170;
    fVar312 = auVar269._24_4_ * fVar167 + fVar329 * fVar23;
    fVar313 = fVar323 + fVar322 + fVar313;
    auVar96 = vshufps_avx(auVar230,auVar230,0xff);
    fVar218 = auVar96._0_4_;
    fVar221 = auVar96._4_4_;
    fVar169 = auVar96._8_4_;
    fVar165 = auVar96._12_4_;
    fVar297 = auVar269._0_4_ * fVar218 + fVar195 * fVar216;
    fVar217 = auVar269._4_4_ * fVar221 + fVar197 * fVar219;
    fVar298 = auVar269._8_4_ * fVar169 + fVar199 * fVar222;
    fVar220 = auVar269._12_4_ * fVar165 + fVar172 * fVar173;
    fVar304 = auVar269._16_4_ * fVar218 + fVar168 * fVar216;
    fVar223 = auVar269._20_4_ * fVar221 + fVar170 * fVar219;
    fVar305 = auVar269._24_4_ * fVar169 + fVar23 * fVar222;
    auVar96 = vshufps_avx(auVar130,auVar130,0xaa);
    auVar191 = vshufps_avx(auVar130,auVar130,0xff);
    fVar322 = auVar191._12_4_;
    auVar85._0_4_ =
         auVar269._0_4_ * fVar306 + fVar195 * (fVar324 * auVar269._0_4_ + auVar205._0_4_ * fVar195);
    auVar85._4_4_ =
         auVar269._4_4_ * fVar307 + fVar197 * (fVar328 * auVar269._4_4_ + auVar205._4_4_ * fVar197);
    auVar85._8_4_ =
         auVar269._8_4_ * fVar309 + fVar199 * (fVar329 * auVar269._8_4_ + auVar205._8_4_ * fVar199);
    auVar85._12_4_ =
         auVar269._12_4_ * fVar311 +
         fVar172 * (auVar95._12_4_ * auVar269._12_4_ + auVar205._12_4_ * fVar172);
    auVar85._16_4_ =
         auVar269._16_4_ * fVar308 +
         fVar168 * (fVar324 * auVar269._16_4_ + auVar205._0_4_ * fVar168);
    auVar85._20_4_ =
         auVar269._20_4_ * fVar310 +
         fVar170 * (fVar328 * auVar269._20_4_ + auVar205._4_4_ * fVar170);
    auVar85._24_4_ =
         auVar269._24_4_ * fVar312 + fVar23 * (fVar329 * auVar269._24_4_ + auVar205._8_4_ * fVar23);
    auVar85._28_4_ = fVar322 + auVar18._28_4_ + auVar15._28_4_;
    auVar321._0_4_ =
         auVar269._0_4_ * fVar297 + fVar195 * (auVar269._0_4_ * fVar216 + auVar139._0_4_ * fVar195);
    auVar321._4_4_ =
         auVar269._4_4_ * fVar217 + fVar197 * (auVar269._4_4_ * fVar219 + auVar139._4_4_ * fVar197);
    auVar321._8_4_ =
         auVar269._8_4_ * fVar298 + fVar199 * (auVar269._8_4_ * fVar222 + auVar139._8_4_ * fVar199);
    auVar321._12_4_ =
         auVar269._12_4_ * fVar220 + fVar172 * (auVar269._12_4_ * fVar173 + fVar323 * fVar172);
    auVar321._16_4_ =
         auVar269._16_4_ * fVar304 +
         fVar168 * (auVar269._16_4_ * fVar216 + auVar139._0_4_ * fVar168);
    auVar321._20_4_ =
         auVar269._20_4_ * fVar223 +
         fVar170 * (auVar269._20_4_ * fVar219 + auVar139._4_4_ * fVar170);
    auVar321._24_4_ =
         auVar269._24_4_ * fVar305 + fVar23 * (auVar269._24_4_ * fVar222 + auVar139._8_4_ * fVar23);
    auVar321._28_4_ = fVar322 + auVar15._28_4_ + auVar161._28_4_;
    auVar15 = vperm2f128_avx(local_78,local_78,1);
    auVar15 = vshufps_avx(auVar15,local_78,0x30);
    _local_3a8 = vshufps_avx(local_78,auVar15,0x29);
    auVar162._0_4_ =
         fVar195 * fVar306 + auVar269._0_4_ * (auVar96._0_4_ * auVar269._0_4_ + fVar195 * fVar196);
    auVar162._4_4_ =
         fVar197 * fVar307 + auVar269._4_4_ * (auVar96._4_4_ * auVar269._4_4_ + fVar197 * fVar198);
    auVar162._8_4_ =
         fVar199 * fVar309 + auVar269._8_4_ * (auVar96._8_4_ * auVar269._8_4_ + fVar199 * fVar167);
    auVar162._12_4_ =
         fVar172 * fVar311 +
         auVar269._12_4_ * (auVar96._12_4_ * auVar269._12_4_ + fVar172 * fVar174);
    auVar162._16_4_ =
         fVar168 * fVar308 + auVar269._16_4_ * (auVar96._0_4_ * auVar269._16_4_ + fVar168 * fVar196)
    ;
    auVar162._20_4_ =
         fVar170 * fVar310 + auVar269._20_4_ * (auVar96._4_4_ * auVar269._20_4_ + fVar170 * fVar198)
    ;
    auVar162._24_4_ =
         fVar23 * fVar312 + auVar269._24_4_ * (auVar96._8_4_ * auVar269._24_4_ + fVar23 * fVar167);
    auVar162._28_4_ = fVar313 + auVar96._12_4_ + fVar174;
    auVar215._0_4_ =
         fVar195 * fVar297 + auVar269._0_4_ * (auVar191._0_4_ * auVar269._0_4_ + fVar195 * fVar218);
    auVar215._4_4_ =
         fVar197 * fVar217 + auVar269._4_4_ * (auVar191._4_4_ * auVar269._4_4_ + fVar197 * fVar221);
    auVar215._8_4_ =
         fVar199 * fVar298 + auVar269._8_4_ * (auVar191._8_4_ * auVar269._8_4_ + fVar199 * fVar169);
    auVar215._12_4_ =
         fVar172 * fVar220 + auVar269._12_4_ * (fVar322 * auVar269._12_4_ + fVar172 * fVar165);
    auVar215._16_4_ =
         fVar168 * fVar304 +
         auVar269._16_4_ * (auVar191._0_4_ * auVar269._16_4_ + fVar168 * fVar218);
    auVar215._20_4_ =
         fVar170 * fVar223 +
         auVar269._20_4_ * (auVar191._4_4_ * auVar269._20_4_ + fVar170 * fVar221);
    auVar215._24_4_ =
         fVar23 * fVar305 + auVar269._24_4_ * (auVar191._8_4_ * auVar269._24_4_ + fVar23 * fVar169);
    auVar215._28_4_ = fVar323 + fVar173 + fVar322 + fVar165;
    auVar240._0_4_ = fVar195 * auVar85._0_4_ + auVar269._0_4_ * auVar162._0_4_;
    auVar240._4_4_ = fVar197 * auVar85._4_4_ + auVar269._4_4_ * auVar162._4_4_;
    auVar240._8_4_ = fVar199 * auVar85._8_4_ + auVar269._8_4_ * auVar162._8_4_;
    auVar240._12_4_ = fVar172 * auVar85._12_4_ + auVar269._12_4_ * auVar162._12_4_;
    auVar240._16_4_ = fVar168 * auVar85._16_4_ + auVar269._16_4_ * auVar162._16_4_;
    auVar240._20_4_ = fVar170 * auVar85._20_4_ + auVar269._20_4_ * auVar162._20_4_;
    auVar240._24_4_ = fVar23 * auVar85._24_4_ + auVar269._24_4_ * auVar162._24_4_;
    auVar240._28_4_ = fVar313 + fVar322 + fVar165;
    auVar250._0_4_ = fVar195 * auVar321._0_4_ + auVar269._0_4_ * auVar215._0_4_;
    auVar250._4_4_ = fVar197 * auVar321._4_4_ + auVar269._4_4_ * auVar215._4_4_;
    auVar250._8_4_ = fVar199 * auVar321._8_4_ + auVar269._8_4_ * auVar215._8_4_;
    auVar250._12_4_ = fVar172 * auVar321._12_4_ + auVar269._12_4_ * auVar215._12_4_;
    auVar250._16_4_ = fVar168 * auVar321._16_4_ + auVar269._16_4_ * auVar215._16_4_;
    auVar250._20_4_ = fVar170 * auVar321._20_4_ + auVar269._20_4_ * auVar215._20_4_;
    auVar250._24_4_ = fVar23 * auVar321._24_4_ + auVar269._24_4_ * auVar215._24_4_;
    auVar250._28_4_ = auVar16._28_4_ + auVar269._28_4_;
    auVar15 = vsubps_avx(auVar162,auVar85);
    auVar16 = vsubps_avx(auVar215,auVar321);
    local_f8 = local_578 * auVar15._0_4_ * 3.0;
    fStack_f4 = fStack_574 * auVar15._4_4_ * 3.0;
    auVar28._4_4_ = fStack_f4;
    auVar28._0_4_ = local_f8;
    fStack_f0 = fStack_570 * auVar15._8_4_ * 3.0;
    auVar28._8_4_ = fStack_f0;
    fStack_ec = fStack_56c * auVar15._12_4_ * 3.0;
    auVar28._12_4_ = fStack_ec;
    fStack_e8 = local_578 * auVar15._16_4_ * 3.0;
    auVar28._16_4_ = fStack_e8;
    fStack_e4 = fStack_574 * auVar15._20_4_ * 3.0;
    auVar28._20_4_ = fStack_e4;
    fStack_e0 = fStack_570 * auVar15._24_4_ * 3.0;
    auVar28._24_4_ = fStack_e0;
    auVar28._28_4_ = auVar215._28_4_;
    local_118 = local_578 * auVar16._0_4_ * 3.0;
    fStack_114 = fStack_574 * auVar16._4_4_ * 3.0;
    auVar29._4_4_ = fStack_114;
    auVar29._0_4_ = local_118;
    fStack_110 = fStack_570 * auVar16._8_4_ * 3.0;
    auVar29._8_4_ = fStack_110;
    fStack_10c = fStack_56c * auVar16._12_4_ * 3.0;
    auVar29._12_4_ = fStack_10c;
    local_578 = local_578 * auVar16._16_4_ * 3.0;
    auVar29._16_4_ = local_578;
    fStack_574 = fStack_574 * auVar16._20_4_ * 3.0;
    auVar29._20_4_ = fStack_574;
    fStack_570 = fStack_570 * auVar16._24_4_ * 3.0;
    auVar29._24_4_ = fStack_570;
    auVar29._28_4_ = fStack_56c;
    auVar15 = vperm2f128_avx(auVar240,auVar240,1);
    auVar15 = vshufps_avx(auVar15,auVar240,0x30);
    auVar20 = vshufps_avx(auVar240,auVar15,0x29);
    auVar16 = vsubps_avx(auVar240,auVar28);
    auVar15 = vperm2f128_avx(auVar16,auVar16,1);
    auVar15 = vshufps_avx(auVar15,auVar16,0x30);
    auVar21 = vshufps_avx(auVar16,auVar15,0x29);
    auVar16 = vsubps_avx(auVar250,auVar29);
    auVar15 = vperm2f128_avx(auVar16,auVar16,1);
    auVar15 = vshufps_avx(auVar15,auVar16,0x30);
    auVar22 = vshufps_avx(auVar16,auVar15,0x29);
    auVar18 = vsubps_avx(auVar240,local_78);
    auVar25 = vsubps_avx(auVar20,_local_3a8);
    fVar195 = auVar25._0_4_ + auVar18._0_4_;
    fVar216 = auVar25._4_4_ + auVar18._4_4_;
    fVar196 = auVar25._8_4_ + auVar18._8_4_;
    fVar218 = auVar25._12_4_ + auVar18._12_4_;
    fVar197 = auVar25._16_4_ + auVar18._16_4_;
    fVar219 = auVar25._20_4_ + auVar18._20_4_;
    fVar198 = auVar25._24_4_ + auVar18._24_4_;
    auVar16 = vperm2f128_avx(local_98,local_98,1);
    auVar16 = vshufps_avx(auVar16,local_98,0x30);
    local_b8 = vshufps_avx(local_98,auVar16,0x29);
    auVar16 = vperm2f128_avx(auVar250,auVar250,1);
    auVar16 = vshufps_avx(auVar16,auVar250,0x30);
    auVar24 = vshufps_avx(auVar250,auVar16,0x29);
    auVar16 = vsubps_avx(auVar250,local_98);
    auVar80 = vsubps_avx(auVar24,local_b8);
    fVar221 = auVar16._0_4_ + auVar80._0_4_;
    fVar199 = auVar16._4_4_ + auVar80._4_4_;
    fVar222 = auVar16._8_4_ + auVar80._8_4_;
    fVar167 = auVar16._12_4_ + auVar80._12_4_;
    fVar169 = auVar16._16_4_ + auVar80._16_4_;
    fVar172 = auVar16._20_4_ + auVar80._20_4_;
    fVar173 = auVar16._24_4_ + auVar80._24_4_;
    fVar174 = auVar16._28_4_;
    auVar30._4_4_ = local_98._4_4_ * fVar216;
    auVar30._0_4_ = local_98._0_4_ * fVar195;
    auVar30._8_4_ = local_98._8_4_ * fVar196;
    auVar30._12_4_ = local_98._12_4_ * fVar218;
    auVar30._16_4_ = local_98._16_4_ * fVar197;
    auVar30._20_4_ = local_98._20_4_ * fVar219;
    auVar30._24_4_ = local_98._24_4_ * fVar198;
    auVar30._28_4_ = fVar174;
    auVar31._4_4_ = fVar199 * local_78._4_4_;
    auVar31._0_4_ = fVar221 * local_78._0_4_;
    auVar31._8_4_ = fVar222 * local_78._8_4_;
    auVar31._12_4_ = fVar167 * local_78._12_4_;
    auVar31._16_4_ = fVar169 * local_78._16_4_;
    auVar31._20_4_ = fVar172 * local_78._20_4_;
    auVar31._24_4_ = fVar173 * local_78._24_4_;
    auVar31._28_4_ = auVar15._28_4_;
    auVar16 = vsubps_avx(auVar30,auVar31);
    local_d8 = local_78._0_4_ + local_d8;
    fStack_d4 = local_78._4_4_ + fStack_d4;
    fStack_d0 = local_78._8_4_ + fStack_d0;
    fStack_cc = local_78._12_4_ + fStack_cc;
    fStack_c8 = local_78._16_4_ + fStack_c8;
    fStack_c4 = local_78._20_4_ + fStack_c4;
    fStack_c0 = local_78._24_4_ + fStack_c0;
    fStack_bc = local_78._28_4_ + auVar17._28_4_;
    fVar292 = local_98._0_4_ + fVar292;
    fVar166 = local_98._4_4_ + fVar166;
    fVar293 = local_98._8_4_ + fVar293;
    fVar171 = local_98._12_4_ + fVar171;
    fVar294 = local_98._16_4_ + fVar294;
    fVar295 = local_98._20_4_ + fVar295;
    fVar296 = local_98._24_4_ + fVar296;
    auVar32._4_4_ = fVar166 * fVar216;
    auVar32._0_4_ = fVar292 * fVar195;
    auVar32._8_4_ = fVar293 * fVar196;
    auVar32._12_4_ = fVar171 * fVar218;
    auVar32._16_4_ = fVar294 * fVar197;
    auVar32._20_4_ = fVar295 * fVar219;
    auVar32._24_4_ = fVar296 * fVar198;
    auVar32._28_4_ = fVar174;
    auVar33._4_4_ = fVar199 * fStack_d4;
    auVar33._0_4_ = fVar221 * local_d8;
    auVar33._8_4_ = fVar222 * fStack_d0;
    auVar33._12_4_ = fVar167 * fStack_cc;
    auVar33._16_4_ = fVar169 * fStack_c8;
    auVar33._20_4_ = fVar172 * fStack_c4;
    auVar33._24_4_ = fVar173 * fStack_c0;
    auVar33._28_4_ = fStack_bc;
    auVar17 = vsubps_avx(auVar32,auVar33);
    auVar34._4_4_ = auVar19._4_4_ * fVar216;
    auVar34._0_4_ = auVar19._0_4_ * fVar195;
    auVar34._8_4_ = auVar19._8_4_ * fVar196;
    auVar34._12_4_ = auVar19._12_4_ * fVar218;
    auVar34._16_4_ = auVar19._16_4_ * fVar197;
    auVar34._20_4_ = auVar19._20_4_ * fVar219;
    auVar34._24_4_ = auVar19._24_4_ * fVar198;
    auVar34._28_4_ = fVar174;
    local_5a8._0_4_ = auVar79._0_4_;
    local_5a8._4_4_ = auVar79._4_4_;
    fStack_5a0 = auVar79._8_4_;
    fStack_59c = auVar79._12_4_;
    fStack_598 = auVar79._16_4_;
    fStack_594 = auVar79._20_4_;
    fStack_590 = auVar79._24_4_;
    auVar35._4_4_ = fVar199 * (float)local_5a8._4_4_;
    auVar35._0_4_ = fVar221 * (float)local_5a8._0_4_;
    auVar35._8_4_ = fVar222 * fStack_5a0;
    auVar35._12_4_ = fVar167 * fStack_59c;
    auVar35._16_4_ = fVar169 * fStack_598;
    auVar35._20_4_ = fVar172 * fStack_594;
    auVar35._24_4_ = fVar173 * fStack_590;
    auVar35._28_4_ = 0x40400000;
    auVar81 = vsubps_avx(auVar34,auVar35);
    auVar36._4_4_ = local_b8._4_4_ * fVar216;
    auVar36._0_4_ = local_b8._0_4_ * fVar195;
    auVar36._8_4_ = local_b8._8_4_ * fVar196;
    auVar36._12_4_ = local_b8._12_4_ * fVar218;
    auVar36._16_4_ = local_b8._16_4_ * fVar197;
    auVar36._20_4_ = local_b8._20_4_ * fVar219;
    auVar36._24_4_ = local_b8._24_4_ * fVar198;
    auVar36._28_4_ = fVar174;
    auVar37._4_4_ = local_3a8._4_4_ * fVar199;
    auVar37._0_4_ = local_3a8._0_4_ * fVar221;
    auVar37._8_4_ = local_3a8._8_4_ * fVar222;
    auVar37._12_4_ = local_3a8._12_4_ * fVar167;
    auVar37._16_4_ = local_3a8._16_4_ * fVar169;
    auVar37._20_4_ = local_3a8._20_4_ * fVar172;
    auVar37._24_4_ = local_3a8._24_4_ * fVar173;
    auVar37._28_4_ = local_b8._28_4_;
    auVar107 = vsubps_avx(auVar36,auVar37);
    auVar38._4_4_ = auVar250._4_4_ * fVar216;
    auVar38._0_4_ = auVar250._0_4_ * fVar195;
    auVar38._8_4_ = auVar250._8_4_ * fVar196;
    auVar38._12_4_ = auVar250._12_4_ * fVar218;
    auVar38._16_4_ = auVar250._16_4_ * fVar197;
    auVar38._20_4_ = auVar250._20_4_ * fVar219;
    auVar38._24_4_ = auVar250._24_4_ * fVar198;
    auVar38._28_4_ = fVar174;
    auVar39._4_4_ = fVar199 * auVar240._4_4_;
    auVar39._0_4_ = fVar221 * auVar240._0_4_;
    auVar39._8_4_ = fVar222 * auVar240._8_4_;
    auVar39._12_4_ = fVar167 * auVar240._12_4_;
    auVar39._16_4_ = fVar169 * auVar240._16_4_;
    auVar39._20_4_ = fVar172 * auVar240._20_4_;
    auVar39._24_4_ = fVar173 * auVar240._24_4_;
    auVar39._28_4_ = auVar19._28_4_;
    auVar108 = vsubps_avx(auVar38,auVar39);
    local_f8 = auVar240._0_4_ + local_f8;
    fStack_f4 = auVar240._4_4_ + fStack_f4;
    fStack_f0 = auVar240._8_4_ + fStack_f0;
    fStack_ec = auVar240._12_4_ + fStack_ec;
    fStack_e8 = auVar240._16_4_ + fStack_e8;
    fStack_e4 = auVar240._20_4_ + fStack_e4;
    fStack_e0 = auVar240._24_4_ + fStack_e0;
    fStack_dc = auVar240._28_4_ + auVar215._28_4_;
    local_118 = auVar250._0_4_ + local_118;
    fStack_114 = auVar250._4_4_ + fStack_114;
    fStack_110 = auVar250._8_4_ + fStack_110;
    fStack_10c = auVar250._12_4_ + fStack_10c;
    fStack_108 = auVar250._16_4_ + local_578;
    fStack_104 = auVar250._20_4_ + fStack_574;
    fStack_100 = auVar250._24_4_ + fStack_570;
    fStack_fc = auVar250._28_4_ + fStack_56c;
    auVar40._4_4_ = fStack_114 * fVar216;
    auVar40._0_4_ = local_118 * fVar195;
    auVar40._8_4_ = fStack_110 * fVar196;
    auVar40._12_4_ = fStack_10c * fVar218;
    auVar40._16_4_ = fStack_108 * fVar197;
    auVar40._20_4_ = fStack_104 * fVar219;
    auVar40._24_4_ = fStack_100 * fVar198;
    auVar40._28_4_ = auVar250._28_4_ + fStack_56c;
    auVar41._4_4_ = fStack_f4 * fVar199;
    auVar41._0_4_ = local_f8 * fVar221;
    auVar41._8_4_ = fStack_f0 * fVar222;
    auVar41._12_4_ = fStack_ec * fVar167;
    auVar41._16_4_ = fStack_e8 * fVar169;
    auVar41._20_4_ = fStack_e4 * fVar172;
    auVar41._24_4_ = fStack_e0 * fVar173;
    auVar41._28_4_ = fStack_dc;
    auVar109 = vsubps_avx(auVar40,auVar41);
    auVar42._4_4_ = auVar22._4_4_ * fVar216;
    auVar42._0_4_ = auVar22._0_4_ * fVar195;
    auVar42._8_4_ = auVar22._8_4_ * fVar196;
    auVar42._12_4_ = auVar22._12_4_ * fVar218;
    auVar42._16_4_ = auVar22._16_4_ * fVar197;
    auVar42._20_4_ = auVar22._20_4_ * fVar219;
    auVar42._24_4_ = auVar22._24_4_ * fVar198;
    auVar42._28_4_ = fStack_dc;
    auVar43._4_4_ = fVar199 * auVar21._4_4_;
    auVar43._0_4_ = fVar221 * auVar21._0_4_;
    auVar43._8_4_ = fVar222 * auVar21._8_4_;
    auVar43._12_4_ = fVar167 * auVar21._12_4_;
    auVar43._16_4_ = fVar169 * auVar21._16_4_;
    auVar43._20_4_ = fVar172 * auVar21._20_4_;
    auVar43._24_4_ = fVar173 * auVar21._24_4_;
    auVar43._28_4_ = auVar21._28_4_;
    auVar110 = vsubps_avx(auVar42,auVar43);
    auVar44._4_4_ = auVar24._4_4_ * fVar216;
    auVar44._0_4_ = auVar24._0_4_ * fVar195;
    auVar44._8_4_ = auVar24._8_4_ * fVar196;
    auVar44._12_4_ = auVar24._12_4_ * fVar218;
    auVar44._16_4_ = auVar24._16_4_ * fVar197;
    auVar44._20_4_ = auVar24._20_4_ * fVar219;
    auVar44._24_4_ = auVar24._24_4_ * fVar198;
    auVar44._28_4_ = auVar25._28_4_ + auVar18._28_4_;
    auVar45._4_4_ = auVar20._4_4_ * fVar199;
    auVar45._0_4_ = auVar20._0_4_ * fVar221;
    auVar45._8_4_ = auVar20._8_4_ * fVar222;
    auVar45._12_4_ = auVar20._12_4_ * fVar167;
    auVar45._16_4_ = auVar20._16_4_ * fVar169;
    auVar45._20_4_ = auVar20._20_4_ * fVar172;
    auVar45._24_4_ = auVar20._24_4_ * fVar173;
    auVar45._28_4_ = fVar174 + auVar80._28_4_;
    auVar25 = vsubps_avx(auVar44,auVar45);
    auVar15 = vminps_avx(auVar16,auVar17);
    auVar79 = vmaxps_avx(auVar16,auVar17);
    auVar16 = vminps_avx(auVar81,auVar107);
    auVar16 = vminps_avx(auVar15,auVar16);
    auVar15 = vmaxps_avx(auVar81,auVar107);
    auVar79 = vmaxps_avx(auVar79,auVar15);
    auVar17 = vminps_avx(auVar108,auVar109);
    auVar15 = vmaxps_avx(auVar108,auVar109);
    auVar18 = vminps_avx(auVar110,auVar25);
    auVar17 = vminps_avx(auVar17,auVar18);
    auVar17 = vminps_avx(auVar16,auVar17);
    auVar16 = vmaxps_avx(auVar110,auVar25);
    auVar15 = vmaxps_avx(auVar15,auVar16);
    auVar15 = vmaxps_avx(auVar79,auVar15);
    auVar79 = vcmpps_avx(auVar17,local_138,2);
    auVar15 = vcmpps_avx(auVar15,local_158,5);
    auVar79 = vandps_avx(auVar15,auVar79);
    auVar15 = local_248 & auVar79;
    uVar68 = 0;
    if ((((((((auVar15 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar15 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar15 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar15 >> 0x7f,0) != '\0') ||
          (auVar15 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar15 >> 0xbf,0) != '\0') ||
        (auVar15 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar15[0x1f] < '\0')
    {
      auVar15 = vsubps_avx(_local_3a8,local_78);
      auVar16 = vsubps_avx(auVar20,auVar240);
      fVar216 = auVar15._0_4_ + auVar16._0_4_;
      fVar196 = auVar15._4_4_ + auVar16._4_4_;
      fVar218 = auVar15._8_4_ + auVar16._8_4_;
      fVar197 = auVar15._12_4_ + auVar16._12_4_;
      fVar219 = auVar15._16_4_ + auVar16._16_4_;
      fVar198 = auVar15._20_4_ + auVar16._20_4_;
      fVar221 = auVar15._24_4_ + auVar16._24_4_;
      auVar17 = vsubps_avx(local_b8,local_98);
      auVar18 = vsubps_avx(auVar24,auVar250);
      fVar199 = auVar17._0_4_ + auVar18._0_4_;
      fVar222 = auVar17._4_4_ + auVar18._4_4_;
      fVar167 = auVar17._8_4_ + auVar18._8_4_;
      fVar169 = auVar17._12_4_ + auVar18._12_4_;
      fVar172 = auVar17._16_4_ + auVar18._16_4_;
      fVar173 = auVar17._20_4_ + auVar18._20_4_;
      fVar174 = auVar17._24_4_ + auVar18._24_4_;
      fVar195 = auVar18._28_4_;
      auVar46._4_4_ = local_98._4_4_ * fVar196;
      auVar46._0_4_ = local_98._0_4_ * fVar216;
      auVar46._8_4_ = local_98._8_4_ * fVar218;
      auVar46._12_4_ = local_98._12_4_ * fVar197;
      auVar46._16_4_ = local_98._16_4_ * fVar219;
      auVar46._20_4_ = local_98._20_4_ * fVar198;
      auVar46._24_4_ = local_98._24_4_ * fVar221;
      auVar46._28_4_ = local_98._28_4_;
      auVar47._4_4_ = local_78._4_4_ * fVar222;
      auVar47._0_4_ = local_78._0_4_ * fVar199;
      auVar47._8_4_ = local_78._8_4_ * fVar167;
      auVar47._12_4_ = local_78._12_4_ * fVar169;
      auVar47._16_4_ = local_78._16_4_ * fVar172;
      auVar47._20_4_ = local_78._20_4_ * fVar173;
      auVar47._24_4_ = local_78._24_4_ * fVar174;
      auVar47._28_4_ = local_78._28_4_;
      auVar18 = vsubps_avx(auVar46,auVar47);
      auVar48._4_4_ = fVar166 * fVar196;
      auVar48._0_4_ = fVar292 * fVar216;
      auVar48._8_4_ = fVar293 * fVar218;
      auVar48._12_4_ = fVar171 * fVar197;
      auVar48._16_4_ = fVar294 * fVar219;
      auVar48._20_4_ = fVar295 * fVar198;
      auVar48._24_4_ = fVar296 * fVar221;
      auVar48._28_4_ = local_98._28_4_;
      auVar49._4_4_ = fVar222 * fStack_d4;
      auVar49._0_4_ = fVar199 * local_d8;
      auVar49._8_4_ = fVar167 * fStack_d0;
      auVar49._12_4_ = fVar169 * fStack_cc;
      auVar49._16_4_ = fVar172 * fStack_c8;
      auVar49._20_4_ = fVar173 * fStack_c4;
      auVar49._24_4_ = fVar174 * fStack_c0;
      auVar49._28_4_ = fVar195;
      auVar25 = vsubps_avx(auVar48,auVar49);
      auVar50._4_4_ = fVar196 * auVar19._4_4_;
      auVar50._0_4_ = fVar216 * auVar19._0_4_;
      auVar50._8_4_ = fVar218 * auVar19._8_4_;
      auVar50._12_4_ = fVar197 * auVar19._12_4_;
      auVar50._16_4_ = fVar219 * auVar19._16_4_;
      auVar50._20_4_ = fVar198 * auVar19._20_4_;
      auVar50._24_4_ = fVar221 * auVar19._24_4_;
      auVar50._28_4_ = fVar195;
      auVar51._4_4_ = fVar222 * (float)local_5a8._4_4_;
      auVar51._0_4_ = fVar199 * (float)local_5a8._0_4_;
      auVar51._8_4_ = fVar167 * fStack_5a0;
      auVar51._12_4_ = fVar169 * fStack_59c;
      auVar51._16_4_ = fVar172 * fStack_598;
      auVar51._20_4_ = fVar173 * fStack_594;
      auVar51._24_4_ = fVar174 * fStack_590;
      auVar51._28_4_ = local_98._28_4_ + auVar161._28_4_;
      auVar19 = vsubps_avx(auVar50,auVar51);
      auVar52._4_4_ = local_b8._4_4_ * fVar196;
      auVar52._0_4_ = local_b8._0_4_ * fVar216;
      auVar52._8_4_ = local_b8._8_4_ * fVar218;
      auVar52._12_4_ = local_b8._12_4_ * fVar197;
      auVar52._16_4_ = local_b8._16_4_ * fVar219;
      auVar52._20_4_ = local_b8._20_4_ * fVar198;
      auVar52._24_4_ = local_b8._24_4_ * fVar221;
      auVar52._28_4_ = local_98._28_4_ + auVar161._28_4_;
      auVar53._4_4_ = local_3a8._4_4_ * fVar222;
      auVar53._0_4_ = local_3a8._0_4_ * fVar199;
      auVar53._8_4_ = local_3a8._8_4_ * fVar167;
      auVar53._12_4_ = local_3a8._12_4_ * fVar169;
      auVar53._16_4_ = local_3a8._16_4_ * fVar172;
      auVar53._20_4_ = local_3a8._20_4_ * fVar173;
      uVar2 = local_3a8._28_4_;
      auVar53._24_4_ = local_3a8._24_4_ * fVar174;
      auVar53._28_4_ = uVar2;
      auVar80 = vsubps_avx(auVar52,auVar53);
      auVar54._4_4_ = auVar250._4_4_ * fVar196;
      auVar54._0_4_ = auVar250._0_4_ * fVar216;
      auVar54._8_4_ = auVar250._8_4_ * fVar218;
      auVar54._12_4_ = auVar250._12_4_ * fVar197;
      auVar54._16_4_ = auVar250._16_4_ * fVar219;
      auVar54._20_4_ = auVar250._20_4_ * fVar198;
      auVar54._24_4_ = auVar250._24_4_ * fVar221;
      auVar54._28_4_ = auVar250._28_4_;
      auVar55._4_4_ = auVar240._4_4_ * fVar222;
      auVar55._0_4_ = auVar240._0_4_ * fVar199;
      auVar55._8_4_ = auVar240._8_4_ * fVar167;
      auVar55._12_4_ = auVar240._12_4_ * fVar169;
      auVar55._16_4_ = auVar240._16_4_ * fVar172;
      auVar55._20_4_ = auVar240._20_4_ * fVar173;
      auVar55._24_4_ = auVar240._24_4_ * fVar174;
      auVar55._28_4_ = auVar240._28_4_;
      auVar81 = vsubps_avx(auVar54,auVar55);
      auVar56._4_4_ = fVar196 * fStack_114;
      auVar56._0_4_ = fVar216 * local_118;
      auVar56._8_4_ = fVar218 * fStack_110;
      auVar56._12_4_ = fVar197 * fStack_10c;
      auVar56._16_4_ = fVar219 * fStack_108;
      auVar56._20_4_ = fVar198 * fStack_104;
      auVar56._24_4_ = fVar221 * fStack_100;
      auVar56._28_4_ = auVar250._28_4_;
      auVar57._4_4_ = fVar222 * fStack_f4;
      auVar57._0_4_ = fVar199 * local_f8;
      auVar57._8_4_ = fVar167 * fStack_f0;
      auVar57._12_4_ = fVar169 * fStack_ec;
      auVar57._16_4_ = fVar172 * fStack_e8;
      auVar57._20_4_ = fVar173 * fStack_e4;
      auVar57._24_4_ = fVar174 * fStack_e0;
      auVar57._28_4_ = uVar2;
      auVar107 = vsubps_avx(auVar56,auVar57);
      auVar58._4_4_ = fVar196 * auVar22._4_4_;
      auVar58._0_4_ = fVar216 * auVar22._0_4_;
      auVar58._8_4_ = fVar218 * auVar22._8_4_;
      auVar58._12_4_ = fVar197 * auVar22._12_4_;
      auVar58._16_4_ = fVar219 * auVar22._16_4_;
      auVar58._20_4_ = fVar198 * auVar22._20_4_;
      auVar58._24_4_ = fVar221 * auVar22._24_4_;
      auVar58._28_4_ = uVar2;
      auVar59._4_4_ = fVar222 * auVar21._4_4_;
      auVar59._0_4_ = fVar199 * auVar21._0_4_;
      auVar59._8_4_ = fVar167 * auVar21._8_4_;
      auVar59._12_4_ = fVar169 * auVar21._12_4_;
      auVar59._16_4_ = fVar172 * auVar21._16_4_;
      auVar59._20_4_ = fVar173 * auVar21._20_4_;
      auVar59._24_4_ = fVar174 * auVar21._24_4_;
      auVar59._28_4_ = local_b8._28_4_;
      auVar21 = vsubps_avx(auVar58,auVar59);
      auVar60._4_4_ = auVar24._4_4_ * fVar196;
      auVar60._0_4_ = auVar24._0_4_ * fVar216;
      auVar60._8_4_ = auVar24._8_4_ * fVar218;
      auVar60._12_4_ = auVar24._12_4_ * fVar197;
      auVar60._16_4_ = auVar24._16_4_ * fVar219;
      auVar60._20_4_ = auVar24._20_4_ * fVar198;
      auVar60._24_4_ = auVar24._24_4_ * fVar221;
      auVar60._28_4_ = auVar15._28_4_ + auVar16._28_4_;
      auVar61._4_4_ = auVar20._4_4_ * fVar222;
      auVar61._0_4_ = auVar20._0_4_ * fVar199;
      auVar61._8_4_ = auVar20._8_4_ * fVar167;
      auVar61._12_4_ = auVar20._12_4_ * fVar169;
      auVar61._16_4_ = auVar20._16_4_ * fVar172;
      auVar61._20_4_ = auVar20._20_4_ * fVar173;
      auVar61._24_4_ = auVar20._24_4_ * fVar174;
      auVar61._28_4_ = auVar17._28_4_ + fVar195;
      auVar20 = vsubps_avx(auVar60,auVar61);
      auVar16 = vminps_avx(auVar18,auVar25);
      auVar15 = vmaxps_avx(auVar18,auVar25);
      auVar17 = vminps_avx(auVar19,auVar80);
      auVar17 = vminps_avx(auVar16,auVar17);
      auVar16 = vmaxps_avx(auVar19,auVar80);
      auVar15 = vmaxps_avx(auVar15,auVar16);
      auVar18 = vminps_avx(auVar81,auVar107);
      auVar16 = vmaxps_avx(auVar81,auVar107);
      auVar19 = vminps_avx(auVar21,auVar20);
      auVar18 = vminps_avx(auVar18,auVar19);
      auVar18 = vminps_avx(auVar17,auVar18);
      auVar17 = vmaxps_avx(auVar21,auVar20);
      auVar16 = vmaxps_avx(auVar16,auVar17);
      auVar16 = vmaxps_avx(auVar15,auVar16);
      auVar15 = vcmpps_avx(auVar18,local_138,2);
      auVar16 = vcmpps_avx(auVar16,local_158,5);
      auVar15 = vandps_avx(auVar16,auVar15);
      auVar79 = vandps_avx(auVar79,local_248);
      auVar16 = auVar79 & auVar15;
      if ((((((((auVar16 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar16 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar16 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar16 >> 0x7f,0) != '\0') ||
            (auVar16 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar16 >> 0xbf,0) != '\0') ||
          (auVar16 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar16[0x1f] < '\0') {
        auVar79 = vandps_avx(auVar15,auVar79);
        uVar68 = vmovmskps_avx(auVar79);
      }
    }
    if (uVar68 != 0) {
      auStack_388[uVar71] = uVar68;
      uVar3 = vmovlps_avx(local_308);
      *(undefined8 *)(afStack_228 + uVar71 * 2) = uVar3;
      uVar4 = vmovlps_avx(_local_5f8);
      auStack_58[uVar71] = uVar4;
      uVar71 = (ulong)((int)uVar71 + 1);
    }
    auVar334 = ZEXT464(0) << 0x20;
    do {
      if ((int)uVar71 == 0) {
        uVar2 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar86._4_4_ = uVar2;
        auVar86._0_4_ = uVar2;
        auVar86._8_4_ = uVar2;
        auVar86._12_4_ = uVar2;
        auVar86._16_4_ = uVar2;
        auVar86._20_4_ = uVar2;
        auVar86._24_4_ = uVar2;
        auVar86._28_4_ = uVar2;
        auVar79 = vcmpps_avx(local_178,auVar86,2);
        uVar67 = vmovmskps_avx(auVar79);
        uVar67 = (uint)uVar73 & uVar67;
        if (uVar67 == 0) {
          return;
        }
        goto LAB_0110d559;
      }
      uVar69 = (int)uVar71 - 1;
      uVar70 = (ulong)uVar69;
      uVar68 = auStack_388[uVar70];
      fVar195 = afStack_228[uVar70 * 2];
      fVar216 = afStack_228[uVar70 * 2 + 1];
      register0x00001548 = 0;
      local_5f8 = (undefined1  [8])auStack_58[uVar70];
      uVar4 = 0;
      if (uVar68 != 0) {
        for (; (uVar68 >> uVar4 & 1) == 0; uVar4 = uVar4 + 1) {
        }
      }
      uVar68 = uVar68 - 1 & uVar68;
      auStack_388[uVar70] = uVar68;
      if (uVar68 == 0) {
        uVar71 = (ulong)uVar69;
      }
      fVar218 = (float)(uVar4 + 1) * 0.14285715;
      fVar196 = (1.0 - (float)uVar4 * 0.14285715) * fVar195 + fVar216 * (float)uVar4 * 0.14285715;
      fVar195 = (1.0 - fVar218) * fVar195 + fVar216 * fVar218;
      fVar216 = fVar195 - fVar196;
      if (0.16666667 <= fVar216) break;
      auVar96 = vshufps_avx(_local_5f8,_local_5f8,0x50);
      auVar117._8_4_ = 0x3f800000;
      auVar117._0_8_ = &DAT_3f8000003f800000;
      auVar117._12_4_ = 0x3f800000;
      auVar205 = vsubps_avx(auVar117,auVar96);
      fVar218 = auVar96._0_4_;
      fVar197 = auVar96._4_4_;
      fVar219 = auVar96._8_4_;
      fVar198 = auVar96._12_4_;
      fVar221 = auVar205._0_4_;
      fVar199 = auVar205._4_4_;
      fVar222 = auVar205._8_4_;
      fVar167 = auVar205._12_4_;
      auVar131._0_4_ = auVar272._0_4_ * fVar218 + fVar221 * fVar200;
      auVar131._4_4_ = auVar272._4_4_ * fVar197 + fVar199 * fVar150;
      auVar131._8_4_ = auVar272._0_4_ * fVar219 + fVar222 * fVar200;
      auVar131._12_4_ = auVar272._4_4_ * fVar198 + fVar167 * fVar150;
      auVar152._0_4_ = auVar257._0_4_ * fVar218 + fVar221 * fVar224;
      auVar152._4_4_ = auVar257._4_4_ * fVar197 + fVar199 * fVar164;
      auVar152._8_4_ = auVar257._0_4_ * fVar219 + fVar222 * fVar224;
      auVar152._12_4_ = auVar257._4_4_ * fVar198 + fVar167 * fVar164;
      auVar183._0_4_ = auVar90._0_4_ * fVar218 + auVar316._0_4_ * fVar221;
      auVar183._4_4_ = auVar90._4_4_ * fVar197 + auVar316._4_4_ * fVar199;
      auVar183._8_4_ = auVar90._0_4_ * fVar219 + auVar316._0_4_ * fVar222;
      auVar183._12_4_ = auVar90._4_4_ * fVar198 + auVar316._4_4_ * fVar167;
      auVar92._0_4_ = auVar75._0_4_ * fVar218 + auVar300._0_4_ * fVar221;
      auVar92._4_4_ = auVar75._4_4_ * fVar197 + auVar300._4_4_ * fVar199;
      auVar92._8_4_ = auVar75._0_4_ * fVar219 + auVar300._0_4_ * fVar222;
      auVar92._12_4_ = auVar75._4_4_ * fVar198 + auVar300._4_4_ * fVar167;
      auVar126._16_16_ = auVar131;
      auVar126._0_16_ = auVar131;
      auVar147._16_16_ = auVar152;
      auVar147._0_16_ = auVar152;
      auVar163._16_16_ = auVar183;
      auVar163._0_16_ = auVar183;
      auVar79 = vshufps_avx(ZEXT2032(CONCAT416(fVar195,ZEXT416((uint)fVar196))),
                            ZEXT2032(CONCAT416(fVar195,ZEXT416((uint)fVar196))),0);
      auVar15 = vsubps_avx(auVar147,auVar126);
      fVar218 = auVar79._0_4_;
      fVar197 = auVar79._4_4_;
      fVar219 = auVar79._8_4_;
      fVar198 = auVar79._12_4_;
      fVar221 = auVar79._16_4_;
      fVar199 = auVar79._20_4_;
      fVar222 = auVar79._24_4_;
      auVar127._0_4_ = auVar131._0_4_ + auVar15._0_4_ * fVar218;
      auVar127._4_4_ = auVar131._4_4_ + auVar15._4_4_ * fVar197;
      auVar127._8_4_ = auVar131._8_4_ + auVar15._8_4_ * fVar219;
      auVar127._12_4_ = auVar131._12_4_ + auVar15._12_4_ * fVar198;
      auVar127._16_4_ = auVar131._0_4_ + auVar15._16_4_ * fVar221;
      auVar127._20_4_ = auVar131._4_4_ + auVar15._20_4_ * fVar199;
      auVar127._24_4_ = auVar131._8_4_ + auVar15._24_4_ * fVar222;
      auVar127._28_4_ = auVar131._12_4_ + auVar15._28_4_;
      auVar15 = vsubps_avx(auVar163,auVar147);
      auVar148._0_4_ = auVar152._0_4_ + auVar15._0_4_ * fVar218;
      auVar148._4_4_ = auVar152._4_4_ + auVar15._4_4_ * fVar197;
      auVar148._8_4_ = auVar152._8_4_ + auVar15._8_4_ * fVar219;
      auVar148._12_4_ = auVar152._12_4_ + auVar15._12_4_ * fVar198;
      auVar148._16_4_ = auVar152._0_4_ + auVar15._16_4_ * fVar221;
      auVar148._20_4_ = auVar152._4_4_ + auVar15._20_4_ * fVar199;
      auVar148._24_4_ = auVar152._8_4_ + auVar15._24_4_ * fVar222;
      auVar148._28_4_ = auVar152._12_4_ + auVar15._28_4_;
      auVar96 = vsubps_avx(auVar92,auVar183);
      auVar111._0_4_ = auVar183._0_4_ + auVar96._0_4_ * fVar218;
      auVar111._4_4_ = auVar183._4_4_ + auVar96._4_4_ * fVar197;
      auVar111._8_4_ = auVar183._8_4_ + auVar96._8_4_ * fVar219;
      auVar111._12_4_ = auVar183._12_4_ + auVar96._12_4_ * fVar198;
      auVar111._16_4_ = auVar183._0_4_ + auVar96._0_4_ * fVar221;
      auVar111._20_4_ = auVar183._4_4_ + auVar96._4_4_ * fVar199;
      auVar111._24_4_ = auVar183._8_4_ + auVar96._8_4_ * fVar222;
      auVar111._28_4_ = auVar183._12_4_ + auVar96._12_4_;
      auVar15 = vsubps_avx(auVar148,auVar127);
      auVar128._0_4_ = auVar127._0_4_ + fVar218 * auVar15._0_4_;
      auVar128._4_4_ = auVar127._4_4_ + fVar197 * auVar15._4_4_;
      auVar128._8_4_ = auVar127._8_4_ + fVar219 * auVar15._8_4_;
      auVar128._12_4_ = auVar127._12_4_ + fVar198 * auVar15._12_4_;
      auVar128._16_4_ = auVar127._16_4_ + fVar221 * auVar15._16_4_;
      auVar128._20_4_ = auVar127._20_4_ + fVar199 * auVar15._20_4_;
      auVar128._24_4_ = auVar127._24_4_ + fVar222 * auVar15._24_4_;
      auVar128._28_4_ = auVar127._28_4_ + auVar15._28_4_;
      auVar15 = vsubps_avx(auVar111,auVar148);
      auVar112._0_4_ = auVar148._0_4_ + fVar218 * auVar15._0_4_;
      auVar112._4_4_ = auVar148._4_4_ + fVar197 * auVar15._4_4_;
      auVar112._8_4_ = auVar148._8_4_ + fVar219 * auVar15._8_4_;
      auVar112._12_4_ = auVar148._12_4_ + fVar198 * auVar15._12_4_;
      auVar112._16_4_ = auVar148._16_4_ + fVar221 * auVar15._16_4_;
      auVar112._20_4_ = auVar148._20_4_ + fVar199 * auVar15._20_4_;
      auVar112._24_4_ = auVar148._24_4_ + fVar222 * auVar15._24_4_;
      auVar112._28_4_ = auVar148._28_4_ + auVar15._28_4_;
      auVar15 = vsubps_avx(auVar112,auVar128);
      auVar132._0_4_ = auVar128._0_4_ + fVar218 * auVar15._0_4_;
      auVar132._4_4_ = auVar128._4_4_ + fVar197 * auVar15._4_4_;
      auVar132._8_4_ = auVar128._8_4_ + fVar219 * auVar15._8_4_;
      auVar132._12_4_ = auVar128._12_4_ + fVar198 * auVar15._12_4_;
      auVar149._16_4_ = auVar128._16_4_ + fVar221 * auVar15._16_4_;
      auVar149._0_16_ = auVar132;
      auVar149._20_4_ = auVar128._20_4_ + fVar199 * auVar15._20_4_;
      auVar149._24_4_ = auVar128._24_4_ + fVar222 * auVar15._24_4_;
      auVar149._28_4_ = auVar128._28_4_ + auVar148._28_4_;
      fVar218 = auVar15._4_4_ * 3.0;
      auVar118 = auVar149._16_16_;
      auVar95 = vshufps_avx(ZEXT416((uint)(fVar216 * 0.33333334)),
                            ZEXT416((uint)(fVar216 * 0.33333334)),0);
      auVar258._0_4_ = auVar132._0_4_ + auVar95._0_4_ * auVar15._0_4_ * 3.0;
      auVar258._4_4_ = auVar132._4_4_ + auVar95._4_4_ * fVar218;
      auVar258._8_4_ = auVar132._8_4_ + auVar95._8_4_ * auVar15._8_4_ * 3.0;
      auVar258._12_4_ = auVar132._12_4_ + auVar95._12_4_ * auVar15._12_4_ * 3.0;
      auVar191 = vshufpd_avx(auVar132,auVar132,3);
      auVar139 = vshufpd_avx(auVar118,auVar118,3);
      _local_3a8 = auVar191;
      auVar96 = vsubps_avx(auVar191,auVar132);
      auVar205 = vsubps_avx(auVar139,auVar118);
      auVar93._0_4_ = auVar96._0_4_ + auVar205._0_4_;
      auVar93._4_4_ = auVar96._4_4_ + auVar205._4_4_;
      auVar93._8_4_ = auVar96._8_4_ + auVar205._8_4_;
      auVar93._12_4_ = auVar96._12_4_ + auVar205._12_4_;
      auVar96 = vmovshdup_avx(auVar132);
      auVar205 = vmovshdup_avx(auVar258);
      auVar138 = vshufps_avx(auVar93,auVar93,0);
      auVar77 = vshufps_avx(auVar93,auVar93,0x55);
      fVar199 = auVar77._0_4_;
      fVar222 = auVar77._4_4_;
      fVar167 = auVar77._8_4_;
      fVar169 = auVar77._12_4_;
      fVar197 = auVar138._0_4_;
      fVar219 = auVar138._4_4_;
      fVar198 = auVar138._8_4_;
      fVar221 = auVar138._12_4_;
      auVar243._0_4_ = fVar197 * auVar132._0_4_ + fVar199 * auVar96._0_4_;
      auVar243._4_4_ = fVar219 * auVar132._4_4_ + fVar222 * auVar96._4_4_;
      auVar243._8_4_ = fVar198 * auVar132._8_4_ + fVar167 * auVar96._8_4_;
      auVar243._12_4_ = fVar221 * auVar132._12_4_ + fVar169 * auVar96._12_4_;
      auVar259._0_4_ = auVar258._0_4_ * fVar197 + fVar199 * auVar205._0_4_;
      auVar259._4_4_ = auVar258._4_4_ * fVar219 + fVar222 * auVar205._4_4_;
      auVar259._8_4_ = auVar258._8_4_ * fVar198 + fVar167 * auVar205._8_4_;
      auVar259._12_4_ = auVar258._12_4_ * fVar221 + fVar169 * auVar205._12_4_;
      auVar205 = vshufps_avx(auVar243,auVar243,0xe8);
      auVar138 = vshufps_avx(auVar259,auVar259,0xe8);
      auVar96 = vcmpps_avx(auVar205,auVar138,1);
      uVar68 = vextractps_avx(auVar96,0);
      auVar77 = auVar259;
      if ((uVar68 & 1) == 0) {
        auVar77 = auVar243;
      }
      auVar94._0_4_ = auVar95._0_4_ * auVar15._16_4_ * 3.0;
      auVar94._4_4_ = auVar95._4_4_ * fVar218;
      auVar94._8_4_ = auVar95._8_4_ * auVar15._24_4_ * 3.0;
      auVar94._12_4_ = auVar95._12_4_ * auVar79._28_4_;
      auVar74 = vsubps_avx(auVar118,auVar94);
      auVar95 = vmovshdup_avx(auVar74);
      auVar118 = vmovshdup_avx(auVar118);
      fVar218 = auVar74._0_4_;
      fVar172 = auVar74._4_4_;
      auVar331._0_4_ = fVar197 * fVar218 + fVar199 * auVar95._0_4_;
      auVar331._4_4_ = fVar219 * fVar172 + fVar222 * auVar95._4_4_;
      auVar331._8_4_ = fVar198 * auVar74._8_4_ + fVar167 * auVar95._8_4_;
      auVar331._12_4_ = fVar221 * auVar74._12_4_ + fVar169 * auVar95._12_4_;
      auVar317._0_4_ = fVar197 * auVar149._16_4_ + fVar199 * auVar118._0_4_;
      auVar317._4_4_ = fVar219 * auVar149._20_4_ + fVar222 * auVar118._4_4_;
      auVar317._8_4_ = fVar198 * auVar149._24_4_ + fVar167 * auVar118._8_4_;
      auVar317._12_4_ = fVar221 * auVar149._28_4_ + fVar169 * auVar118._12_4_;
      auVar118 = vshufps_avx(auVar331,auVar331,0xe8);
      auVar7 = vshufps_avx(auVar317,auVar317,0xe8);
      auVar95 = vcmpps_avx(auVar118,auVar7,1);
      uVar68 = vextractps_avx(auVar95,0);
      auVar87 = auVar317;
      if ((uVar68 & 1) == 0) {
        auVar87 = auVar331;
      }
      auVar77 = vmaxss_avx(auVar87,auVar77);
      auVar205 = vminps_avx(auVar205,auVar138);
      auVar138 = vminps_avx(auVar118,auVar7);
      auVar138 = vminps_avx(auVar205,auVar138);
      auVar96 = vshufps_avx(auVar96,auVar96,0x55);
      auVar96 = vblendps_avx(auVar96,auVar95,2);
      auVar95 = vpslld_avx(auVar96,0x1f);
      auVar96 = vshufpd_avx(auVar259,auVar259,1);
      auVar96 = vinsertps_avx(auVar96,auVar317,0x9c);
      auVar205 = vshufpd_avx(auVar243,auVar243,1);
      auVar205 = vinsertps_avx(auVar205,auVar331,0x9c);
      auVar96 = vblendvps_avx(auVar205,auVar96,auVar95);
      auVar205 = vmovshdup_avx(auVar96);
      auVar96 = vmaxss_avx(auVar205,auVar96);
      fVar198 = auVar138._0_4_;
      auVar205 = vmovshdup_avx(auVar138);
      fVar219 = auVar96._0_4_;
      fVar221 = auVar205._0_4_;
      fVar197 = auVar77._0_4_;
      if ((0.0001 <= fVar198) || (fVar219 <= -0.0001)) {
        if ((-0.0001 < fVar197 && fVar221 < 0.0001) ||
           ((fVar198 < 0.0001 && -0.0001 < fVar197 || (fVar221 < 0.0001 && -0.0001 < fVar219))))
        goto LAB_0110e7df;
LAB_0110f283:
        bVar62 = true;
        auVar334 = ZEXT1664(ZEXT816(0) << 0x40);
      }
      else {
LAB_0110e7df:
        auVar334 = ZEXT464(0) << 0x20;
        auVar95 = vcmpps_avx(auVar138,ZEXT416(0) << 0x20,1);
        auVar205 = vcmpss_avx(auVar77,ZEXT416(0),1);
        auVar184._8_4_ = 0x3f800000;
        auVar184._0_8_ = &DAT_3f8000003f800000;
        auVar184._12_4_ = 0x3f800000;
        auVar260._8_4_ = 0xbf800000;
        auVar260._0_8_ = 0xbf800000bf800000;
        auVar260._12_4_ = 0xbf800000;
        auVar205 = vblendvps_avx(auVar184,auVar260,auVar205);
        auVar95 = vblendvps_avx(auVar184,auVar260,auVar95);
        auVar118 = vcmpss_avx(auVar205,auVar95,4);
        auVar118 = vpshufd_avx(ZEXT416(auVar118._0_4_ & 1),0x50);
        auVar118 = vpslld_avx(auVar118,0x1f);
        auVar118 = vpsrad_avx(auVar118,0x1f);
        auVar118 = vpandn_avx(auVar118,_DAT_02020eb0);
        auVar7 = vmovshdup_avx(auVar95);
        fVar199 = auVar7._0_4_;
        local_538 = auVar5._0_4_;
        fStack_534 = auVar5._4_4_;
        fStack_530 = auVar5._8_4_;
        fStack_52c = auVar5._12_4_;
        if ((auVar95._0_4_ != fVar199) || (NAN(auVar95._0_4_) || NAN(fVar199))) {
          if ((fVar221 != fVar198) || (NAN(fVar221) || NAN(fVar198))) {
            fVar198 = -fVar198 / (fVar221 - fVar198);
            auVar95 = vmovsldup_avx(ZEXT416((uint)((1.0 - fVar198) * 0.0 + fVar198)));
          }
          else {
            auVar95 = vcmpss_avx(auVar138,ZEXT416(0),0);
            auVar95 = vpshufd_avx(ZEXT416(auVar95._0_4_ & 1),0x50);
            auVar95 = vpslld_avx(auVar95,0x1f);
            auVar95 = vblendvps_avx(ZEXT816(0xff8000007f800000),_DAT_01fec6f0,auVar95);
          }
          auVar7 = vcmpps_avx(auVar118,auVar95,1);
          auVar138 = vblendps_avx(auVar118,auVar95,2);
          auVar95 = vblendps_avx(auVar95,auVar118,2);
          auVar118 = vblendvps_avx(auVar95,auVar138,auVar7);
        }
        auVar96 = vcmpss_avx(auVar96,ZEXT416(0),1);
        auVar119._8_4_ = 0x3f800000;
        auVar119._0_8_ = &DAT_3f8000003f800000;
        auVar119._12_4_ = 0x3f800000;
        auVar185._8_4_ = 0xbf800000;
        auVar185._0_8_ = 0xbf800000bf800000;
        auVar185._12_4_ = 0xbf800000;
        auVar96 = vblendvps_avx(auVar119,auVar185,auVar96);
        fVar198 = auVar96._0_4_;
        if ((auVar205._0_4_ != fVar198) || (NAN(auVar205._0_4_) || NAN(fVar198))) {
          if ((fVar219 != fVar197) || (NAN(fVar219) || NAN(fVar197))) {
            fVar197 = -fVar197 / (fVar219 - fVar197);
            auVar96 = vmovsldup_avx(ZEXT416((uint)((1.0 - fVar197) * 0.0 + fVar197)));
          }
          else {
            auVar96 = vcmpss_avx(auVar77,ZEXT416(0),0);
            auVar96 = vpshufd_avx(ZEXT416(auVar96._0_4_ & 1),0x50);
            auVar96 = vpslld_avx(auVar96,0x1f);
            auVar96 = vblendvps_avx(ZEXT816(0xff8000007f800000),_DAT_01fec6f0,auVar96);
          }
          auVar95 = vcmpps_avx(auVar118,auVar96,1);
          auVar205 = vblendps_avx(auVar118,auVar96,2);
          auVar96 = vblendps_avx(auVar96,auVar118,2);
          auVar118 = vblendvps_avx(auVar96,auVar205,auVar95);
        }
        if ((fVar199 != fVar198) || (NAN(fVar199) || NAN(fVar198))) {
          auVar97._8_4_ = 0x3f800000;
          auVar97._0_8_ = &DAT_3f8000003f800000;
          auVar97._12_4_ = 0x3f800000;
          auVar96 = vcmpps_avx(auVar118,auVar97,1);
          auVar205 = vinsertps_avx(auVar118,SUB6416(ZEXT464(0x3f800000),0),0x10);
          auVar186._4_12_ = auVar118._4_12_;
          auVar186._0_4_ = 0x3f800000;
          auVar118 = vblendvps_avx(auVar186,auVar205,auVar96);
        }
        auVar96 = vcmpps_avx(auVar118,_DAT_01fec6f0,1);
        auVar63._12_4_ = 0;
        auVar63._0_12_ = auVar118._4_12_;
        auVar205 = vinsertps_avx(auVar118,ZEXT416(0x3f800000),0x10);
        auVar96 = vblendvps_avx(auVar205,auVar63 << 0x20,auVar96);
        auVar205 = vmovshdup_avx(auVar96);
        bVar62 = true;
        if (auVar96._0_4_ <= auVar205._0_4_) {
          auVar98._0_4_ = auVar96._0_4_ + -0.1;
          auVar98._4_4_ = auVar96._4_4_ + 0.1;
          auVar98._8_4_ = auVar96._8_4_ + 0.0;
          auVar98._12_4_ = auVar96._12_4_ + 0.0;
          auVar95 = vshufpd_avx(auVar258,auVar258,3);
          auVar133._8_8_ = 0x3f80000000000000;
          auVar133._0_8_ = 0x3f80000000000000;
          auVar96 = vcmpps_avx(auVar98,auVar133,1);
          auVar64._12_4_ = 0;
          auVar64._0_12_ = auVar98._4_12_;
          auVar205 = vinsertps_avx(auVar98,SUB6416(ZEXT464(0x3f800000),0),0x10);
          auVar96 = vblendvps_avx(auVar205,auVar64 << 0x20,auVar96);
          auVar205 = vshufpd_avx(auVar74,auVar74,3);
          auVar138 = vshufps_avx(auVar96,auVar96,0x50);
          auVar134._8_4_ = 0x3f800000;
          auVar134._0_8_ = &DAT_3f8000003f800000;
          auVar134._12_4_ = 0x3f800000;
          auVar77 = vsubps_avx(auVar134,auVar138);
          local_3a8._0_4_ = auVar191._0_4_;
          local_3a8._4_4_ = auVar191._4_4_;
          fStack_3a0 = auVar191._8_4_;
          fStack_39c = auVar191._12_4_;
          fVar197 = auVar138._0_4_;
          fVar219 = auVar138._4_4_;
          fVar198 = auVar138._8_4_;
          fVar221 = auVar138._12_4_;
          local_558 = auVar139._0_4_;
          fStack_554 = auVar139._4_4_;
          fStack_550 = auVar139._8_4_;
          fStack_54c = auVar139._12_4_;
          fVar199 = auVar77._0_4_;
          fVar222 = auVar77._4_4_;
          fVar167 = auVar77._8_4_;
          fVar169 = auVar77._12_4_;
          auVar120._0_4_ = fVar197 * (float)local_3a8._0_4_ + fVar199 * auVar132._0_4_;
          auVar120._4_4_ = fVar219 * (float)local_3a8._4_4_ + fVar222 * auVar132._4_4_;
          auVar120._8_4_ = fVar198 * fStack_3a0 + fVar167 * auVar132._0_4_;
          auVar120._12_4_ = fVar221 * fStack_39c + fVar169 * auVar132._4_4_;
          auVar153._0_4_ = fVar197 * auVar95._0_4_ + fVar199 * auVar258._0_4_;
          auVar153._4_4_ = fVar219 * auVar95._4_4_ + fVar222 * auVar258._4_4_;
          auVar153._8_4_ = fVar198 * auVar95._8_4_ + fVar167 * auVar258._0_4_;
          auVar153._12_4_ = fVar221 * auVar95._12_4_ + fVar169 * auVar258._4_4_;
          auVar231._0_4_ = fVar197 * auVar205._0_4_ + fVar199 * fVar218;
          auVar231._4_4_ = fVar219 * auVar205._4_4_ + fVar222 * fVar172;
          auVar231._8_4_ = fVar198 * auVar205._8_4_ + fVar167 * fVar218;
          auVar231._12_4_ = fVar221 * auVar205._12_4_ + fVar169 * fVar172;
          auVar244._0_4_ = fVar197 * local_558 + fVar199 * auVar149._16_4_;
          auVar244._4_4_ = fVar219 * fStack_554 + fVar222 * auVar149._20_4_;
          auVar244._8_4_ = fVar198 * fStack_550 + fVar167 * auVar149._16_4_;
          auVar244._12_4_ = fVar221 * fStack_54c + fVar169 * auVar149._20_4_;
          auVar139 = vsubps_avx(auVar134,auVar96);
          auVar205 = vmovshdup_avx(_local_5f8);
          auVar191 = vmovsldup_avx(_local_5f8);
          local_5f8._0_4_ = auVar139._0_4_ * auVar191._0_4_ + auVar205._0_4_ * auVar96._0_4_;
          local_5f8._4_4_ = auVar139._4_4_ * auVar191._4_4_ + auVar205._4_4_ * auVar96._4_4_;
          fStack_5f0 = auVar139._8_4_ * auVar191._8_4_ + auVar205._8_4_ * auVar96._8_4_;
          fStack_5ec = auVar139._12_4_ * auVar191._12_4_ + auVar205._12_4_ * auVar96._12_4_;
          auVar74 = vmovshdup_avx(_local_5f8);
          auVar96 = vsubps_avx(auVar153,auVar120);
          auVar187._0_4_ = auVar96._0_4_ * 3.0;
          auVar187._4_4_ = auVar96._4_4_ * 3.0;
          auVar187._8_4_ = auVar96._8_4_ * 3.0;
          auVar187._12_4_ = auVar96._12_4_ * 3.0;
          auVar96 = vsubps_avx(auVar231,auVar153);
          auVar208._0_4_ = auVar96._0_4_ * 3.0;
          auVar208._4_4_ = auVar96._4_4_ * 3.0;
          auVar208._8_4_ = auVar96._8_4_ * 3.0;
          auVar208._12_4_ = auVar96._12_4_ * 3.0;
          auVar96 = vsubps_avx(auVar244,auVar231);
          auVar261._0_4_ = auVar96._0_4_ * 3.0;
          auVar261._4_4_ = auVar96._4_4_ * 3.0;
          auVar261._8_4_ = auVar96._8_4_ * 3.0;
          auVar261._12_4_ = auVar96._12_4_ * 3.0;
          auVar205 = vminps_avx(auVar208,auVar261);
          auVar96 = vmaxps_avx(auVar208,auVar261);
          auVar205 = vminps_avx(auVar187,auVar205);
          auVar96 = vmaxps_avx(auVar187,auVar96);
          auVar191 = vshufpd_avx(auVar205,auVar205,3);
          auVar139 = vshufpd_avx(auVar96,auVar96,3);
          auVar205 = vminps_avx(auVar205,auVar191);
          auVar96 = vmaxps_avx(auVar96,auVar139);
          auVar191 = vshufps_avx(ZEXT416((uint)(1.0 / fVar216)),ZEXT416((uint)(1.0 / fVar216)),0);
          auVar188._0_4_ = auVar191._0_4_ * auVar205._0_4_;
          auVar188._4_4_ = auVar191._4_4_ * auVar205._4_4_;
          auVar188._8_4_ = auVar191._8_4_ * auVar205._8_4_;
          auVar188._12_4_ = auVar191._12_4_ * auVar205._12_4_;
          auVar209._0_4_ = auVar96._0_4_ * auVar191._0_4_;
          auVar209._4_4_ = auVar96._4_4_ * auVar191._4_4_;
          auVar209._8_4_ = auVar96._8_4_ * auVar191._8_4_;
          auVar209._12_4_ = auVar96._12_4_ * auVar191._12_4_;
          auVar77 = ZEXT416((uint)(1.0 / (auVar74._0_4_ - (float)local_5f8._0_4_)));
          auVar96 = vshufpd_avx(auVar120,auVar120,3);
          auVar205 = vshufpd_avx(auVar153,auVar153,3);
          auVar191 = vshufpd_avx(auVar231,auVar231,3);
          auVar139 = vshufpd_avx(auVar244,auVar244,3);
          auVar96 = vsubps_avx(auVar96,auVar120);
          auVar95 = vsubps_avx(auVar205,auVar153);
          auVar138 = vsubps_avx(auVar191,auVar231);
          auVar139 = vsubps_avx(auVar139,auVar244);
          auVar205 = vminps_avx(auVar96,auVar95);
          auVar96 = vmaxps_avx(auVar96,auVar95);
          auVar191 = vminps_avx(auVar138,auVar139);
          auVar191 = vminps_avx(auVar205,auVar191);
          auVar205 = vmaxps_avx(auVar138,auVar139);
          auVar96 = vmaxps_avx(auVar96,auVar205);
          auVar205 = vshufps_avx(auVar77,auVar77,0);
          auVar273._0_4_ = auVar205._0_4_ * auVar191._0_4_;
          auVar273._4_4_ = auVar205._4_4_ * auVar191._4_4_;
          auVar273._8_4_ = auVar205._8_4_ * auVar191._8_4_;
          auVar273._12_4_ = auVar205._12_4_ * auVar191._12_4_;
          auVar285._0_4_ = auVar205._0_4_ * auVar96._0_4_;
          auVar285._4_4_ = auVar205._4_4_ * auVar96._4_4_;
          auVar285._8_4_ = auVar205._8_4_ * auVar96._8_4_;
          auVar285._12_4_ = auVar205._12_4_ * auVar96._12_4_;
          auVar96 = vmovsldup_avx(_local_5f8);
          auVar232._4_12_ = auVar96._4_12_;
          auVar232._0_4_ = fVar196;
          auVar245._4_12_ = local_5f8._4_12_;
          auVar245._0_4_ = fVar195;
          auVar78._0_4_ = (fVar195 + fVar196) * 0.5;
          auVar78._4_4_ = ((float)local_5f8._4_4_ + auVar96._4_4_) * 0.5;
          auVar78._8_4_ = (fStack_5f0 + auVar96._8_4_) * 0.5;
          auVar78._12_4_ = (fStack_5ec + auVar96._12_4_) * 0.5;
          auVar96 = vshufps_avx(auVar78,auVar78,0);
          fVar218 = auVar96._0_4_;
          fVar197 = auVar96._4_4_;
          fVar219 = auVar96._8_4_;
          fVar198 = auVar96._12_4_;
          auVar154._0_4_ = local_538 + fVar218 * (float)local_258._0_4_;
          auVar154._4_4_ = fStack_534 + fVar197 * (float)local_258._4_4_;
          auVar154._8_4_ = fStack_530 + fVar219 * fStack_250;
          auVar154._12_4_ = fStack_52c + fVar198 * fStack_24c;
          local_498 = auVar284._0_4_;
          fStack_494 = auVar284._4_4_;
          fStack_490 = auVar284._8_4_;
          fStack_48c = auVar284._12_4_;
          auVar262._0_4_ = fVar218 * (float)local_268._0_4_ + local_498;
          auVar262._4_4_ = fVar197 * (float)local_268._4_4_ + fStack_494;
          auVar262._8_4_ = fVar219 * fStack_260 + fStack_490;
          auVar262._12_4_ = fVar198 * fStack_25c + fStack_48c;
          local_4a8 = auVar6._0_4_;
          fStack_4a4 = auVar6._4_4_;
          fStack_4a0 = auVar6._8_4_;
          fStack_49c = auVar6._12_4_;
          auVar301._0_4_ = fVar218 * (float)local_278._0_4_ + local_4a8;
          auVar301._4_4_ = fVar197 * (float)local_278._4_4_ + fStack_4a4;
          auVar301._8_4_ = fVar219 * fStack_270 + fStack_4a0;
          auVar301._12_4_ = fVar198 * fStack_26c + fStack_49c;
          auVar96 = vsubps_avx(auVar262,auVar154);
          auVar155._0_4_ = auVar96._0_4_ * fVar218 + auVar154._0_4_;
          auVar155._4_4_ = auVar96._4_4_ * fVar197 + auVar154._4_4_;
          auVar155._8_4_ = auVar96._8_4_ * fVar219 + auVar154._8_4_;
          auVar155._12_4_ = auVar96._12_4_ * fVar198 + auVar154._12_4_;
          auVar96 = vsubps_avx(auVar301,auVar262);
          auVar263._0_4_ = auVar262._0_4_ + auVar96._0_4_ * fVar218;
          auVar263._4_4_ = auVar262._4_4_ + auVar96._4_4_ * fVar197;
          auVar263._8_4_ = auVar262._8_4_ + auVar96._8_4_ * fVar219;
          auVar263._12_4_ = auVar262._12_4_ + auVar96._12_4_ * fVar198;
          auVar96 = vsubps_avx(auVar263,auVar155);
          fVar218 = auVar155._0_4_ + auVar96._0_4_ * fVar218;
          fVar197 = auVar155._4_4_ + auVar96._4_4_ * fVar197;
          auVar121._0_8_ = CONCAT44(fVar197,fVar218);
          auVar121._8_4_ = auVar155._8_4_ + auVar96._8_4_ * fVar219;
          auVar121._12_4_ = auVar155._12_4_ + auVar96._12_4_ * fVar198;
          fVar219 = auVar96._0_4_ * 3.0;
          fVar198 = auVar96._4_4_ * 3.0;
          auVar156._0_8_ = CONCAT44(fVar198,fVar219);
          auVar156._8_4_ = auVar96._8_4_ * 3.0;
          auVar156._12_4_ = auVar96._12_4_ * 3.0;
          auVar264._8_8_ = auVar121._0_8_;
          auVar264._0_8_ = auVar121._0_8_;
          auVar96 = vshufpd_avx(auVar121,auVar121,3);
          auVar205 = vshufps_avx(auVar78,auVar78,0x55);
          auVar138 = vsubps_avx(auVar96,auVar264);
          auVar265._0_4_ = auVar205._0_4_ * auVar138._0_4_ + fVar218;
          auVar265._4_4_ = auVar205._4_4_ * auVar138._4_4_ + fVar197;
          auVar265._8_4_ = auVar205._8_4_ * auVar138._8_4_ + fVar218;
          auVar265._12_4_ = auVar205._12_4_ * auVar138._12_4_ + fVar197;
          auVar318._8_8_ = auVar156._0_8_;
          auVar318._0_8_ = auVar156._0_8_;
          auVar96 = vshufpd_avx(auVar156,auVar156,1);
          auVar96 = vsubps_avx(auVar96,auVar318);
          auVar157._0_4_ = fVar219 + auVar205._0_4_ * auVar96._0_4_;
          auVar157._4_4_ = fVar198 + auVar205._4_4_ * auVar96._4_4_;
          auVar157._8_4_ = fVar219 + auVar205._8_4_ * auVar96._8_4_;
          auVar157._12_4_ = fVar198 + auVar205._12_4_ * auVar96._12_4_;
          auVar205 = vmovshdup_avx(auVar157);
          auVar319._0_8_ = auVar205._0_8_ ^ 0x8000000080000000;
          auVar319._8_4_ = auVar205._8_4_ ^ 0x80000000;
          auVar319._12_4_ = auVar205._12_4_ ^ 0x80000000;
          auVar191 = vmovshdup_avx(auVar138);
          auVar96 = vunpcklps_avx(auVar191,auVar319);
          auVar139 = vshufps_avx(auVar96,auVar319,4);
          auVar122._0_8_ = auVar138._0_8_ ^ 0x8000000080000000;
          auVar122._8_4_ = -auVar138._8_4_;
          auVar122._12_4_ = -auVar138._12_4_;
          auVar96 = vmovlhps_avx(auVar122,auVar157);
          auVar95 = vshufps_avx(auVar96,auVar157,8);
          auVar96 = ZEXT416((uint)(auVar191._0_4_ * auVar157._0_4_ - auVar205._0_4_ * auVar138._0_4_
                                  ));
          auVar205 = vshufps_avx(auVar96,auVar96,0);
          auVar96 = vdivps_avx(auVar139,auVar205);
          auVar205 = vdivps_avx(auVar95,auVar205);
          auVar95 = vinsertps_avx(auVar188,auVar273,0x1c);
          auVar138 = vinsertps_avx(auVar209,auVar285,0x1c);
          auVar77 = vinsertps_avx(auVar273,auVar188,0x4c);
          auVar118 = vinsertps_avx(auVar285,auVar209,0x4c);
          auVar191 = vmovsldup_avx(auVar96);
          auVar286._0_4_ = auVar191._0_4_ * auVar95._0_4_;
          auVar286._4_4_ = auVar191._4_4_ * auVar95._4_4_;
          auVar286._8_4_ = auVar191._8_4_ * auVar95._8_4_;
          auVar286._12_4_ = auVar191._12_4_ * auVar95._12_4_;
          auVar274._0_4_ = auVar191._0_4_ * auVar138._0_4_;
          auVar274._4_4_ = auVar191._4_4_ * auVar138._4_4_;
          auVar274._8_4_ = auVar191._8_4_ * auVar138._8_4_;
          auVar274._12_4_ = auVar191._12_4_ * auVar138._12_4_;
          auVar139 = vminps_avx(auVar286,auVar274);
          auVar191 = vmaxps_avx(auVar274,auVar286);
          auVar7 = vmovsldup_avx(auVar205);
          auVar332._0_4_ = auVar7._0_4_ * auVar77._0_4_;
          auVar332._4_4_ = auVar7._4_4_ * auVar77._4_4_;
          auVar332._8_4_ = auVar7._8_4_ * auVar77._8_4_;
          auVar332._12_4_ = auVar7._12_4_ * auVar77._12_4_;
          auVar275._0_4_ = auVar7._0_4_ * auVar118._0_4_;
          auVar275._4_4_ = auVar7._4_4_ * auVar118._4_4_;
          auVar275._8_4_ = auVar7._8_4_ * auVar118._8_4_;
          auVar275._12_4_ = auVar7._12_4_ * auVar118._12_4_;
          auVar7 = vminps_avx(auVar332,auVar275);
          auVar99._0_4_ = auVar139._0_4_ + auVar7._0_4_;
          auVar99._4_4_ = auVar139._4_4_ + auVar7._4_4_;
          auVar99._8_4_ = auVar139._8_4_ + auVar7._8_4_;
          auVar99._12_4_ = auVar139._12_4_ + auVar7._12_4_;
          auVar139 = vmaxps_avx(auVar275,auVar332);
          auVar7 = vsubps_avx(auVar232,auVar78);
          auVar87 = vsubps_avx(auVar245,auVar78);
          auVar246._0_4_ = auVar191._0_4_ + auVar139._0_4_;
          auVar246._4_4_ = auVar191._4_4_ + auVar139._4_4_;
          auVar246._8_4_ = auVar191._8_4_ + auVar139._8_4_;
          auVar246._12_4_ = auVar191._12_4_ + auVar139._12_4_;
          auVar287._8_8_ = 0x3f800000;
          auVar287._0_8_ = 0x3f800000;
          auVar191 = vsubps_avx(auVar287,auVar246);
          auVar139 = vsubps_avx(auVar287,auVar99);
          fVar222 = auVar7._0_4_;
          auVar288._0_4_ = fVar222 * auVar191._0_4_;
          fVar167 = auVar7._4_4_;
          auVar288._4_4_ = fVar167 * auVar191._4_4_;
          fVar169 = auVar7._8_4_;
          auVar288._8_4_ = fVar169 * auVar191._8_4_;
          fVar172 = auVar7._12_4_;
          auVar288._12_4_ = fVar172 * auVar191._12_4_;
          fVar219 = auVar87._0_4_;
          auVar247._0_4_ = auVar191._0_4_ * fVar219;
          fVar198 = auVar87._4_4_;
          auVar247._4_4_ = auVar191._4_4_ * fVar198;
          fVar221 = auVar87._8_4_;
          auVar247._8_4_ = auVar191._8_4_ * fVar221;
          fVar199 = auVar87._12_4_;
          auVar247._12_4_ = auVar191._12_4_ * fVar199;
          auVar326._0_4_ = fVar222 * auVar139._0_4_;
          auVar326._4_4_ = fVar167 * auVar139._4_4_;
          auVar326._8_4_ = fVar169 * auVar139._8_4_;
          auVar326._12_4_ = fVar172 * auVar139._12_4_;
          auVar100._0_4_ = fVar219 * auVar139._0_4_;
          auVar100._4_4_ = fVar198 * auVar139._4_4_;
          auVar100._8_4_ = fVar221 * auVar139._8_4_;
          auVar100._12_4_ = fVar199 * auVar139._12_4_;
          auVar191 = vminps_avx(auVar288,auVar326);
          auVar139 = vminps_avx(auVar247,auVar100);
          auVar7 = vminps_avx(auVar191,auVar139);
          auVar191 = vmaxps_avx(auVar326,auVar288);
          auVar139 = vmaxps_avx(auVar100,auVar247);
          auVar87 = vshufps_avx(auVar78,auVar78,0x54);
          auVar139 = vmaxps_avx(auVar139,auVar191);
          auVar88 = vshufps_avx(auVar265,auVar265,0);
          auVar113 = vshufps_avx(auVar265,auVar265,0x55);
          auVar191 = vhaddps_avx(auVar7,auVar7);
          auVar139 = vhaddps_avx(auVar139,auVar139);
          auVar248._0_4_ = auVar88._0_4_ * auVar96._0_4_ + auVar113._0_4_ * auVar205._0_4_;
          auVar248._4_4_ = auVar88._4_4_ * auVar96._4_4_ + auVar113._4_4_ * auVar205._4_4_;
          auVar248._8_4_ = auVar88._8_4_ * auVar96._8_4_ + auVar113._8_4_ * auVar205._8_4_;
          auVar248._12_4_ = auVar88._12_4_ * auVar96._12_4_ + auVar113._12_4_ * auVar205._12_4_;
          auVar7 = vsubps_avx(auVar87,auVar248);
          fVar218 = auVar7._0_4_ + auVar191._0_4_;
          fVar197 = auVar7._0_4_ + auVar139._0_4_;
          auVar191 = vmaxss_avx(ZEXT416((uint)fVar196),ZEXT416((uint)fVar218));
          auVar139 = vminss_avx(ZEXT416((uint)fVar197),ZEXT416((uint)fVar195));
          if (auVar191._0_4_ <= auVar139._0_4_) {
            auVar191 = vmovshdup_avx(auVar96);
            auVar135._0_4_ = auVar95._0_4_ * auVar191._0_4_;
            auVar135._4_4_ = auVar95._4_4_ * auVar191._4_4_;
            auVar135._8_4_ = auVar95._8_4_ * auVar191._8_4_;
            auVar135._12_4_ = auVar95._12_4_ * auVar191._12_4_;
            auVar101._0_4_ = auVar138._0_4_ * auVar191._0_4_;
            auVar101._4_4_ = auVar138._4_4_ * auVar191._4_4_;
            auVar101._8_4_ = auVar138._8_4_ * auVar191._8_4_;
            auVar101._12_4_ = auVar138._12_4_ * auVar191._12_4_;
            auVar139 = vminps_avx(auVar135,auVar101);
            auVar191 = vmaxps_avx(auVar101,auVar135);
            auVar95 = vmovshdup_avx(auVar205);
            auVar189._0_4_ = auVar95._0_4_ * auVar77._0_4_;
            auVar189._4_4_ = auVar95._4_4_ * auVar77._4_4_;
            auVar189._8_4_ = auVar95._8_4_ * auVar77._8_4_;
            auVar189._12_4_ = auVar95._12_4_ * auVar77._12_4_;
            auVar136._0_4_ = auVar95._0_4_ * auVar118._0_4_;
            auVar136._4_4_ = auVar95._4_4_ * auVar118._4_4_;
            auVar136._8_4_ = auVar95._8_4_ * auVar118._8_4_;
            auVar136._12_4_ = auVar95._12_4_ * auVar118._12_4_;
            auVar95 = vminps_avx(auVar189,auVar136);
            auVar210._0_4_ = auVar139._0_4_ + auVar95._0_4_;
            auVar210._4_4_ = auVar139._4_4_ + auVar95._4_4_;
            auVar210._8_4_ = auVar139._8_4_ + auVar95._8_4_;
            auVar210._12_4_ = auVar139._12_4_ + auVar95._12_4_;
            auVar139 = vmaxps_avx(auVar136,auVar189);
            auVar102._0_4_ = auVar191._0_4_ + auVar139._0_4_;
            auVar102._4_4_ = auVar191._4_4_ + auVar139._4_4_;
            auVar102._8_4_ = auVar191._8_4_ + auVar139._8_4_;
            auVar102._12_4_ = auVar191._12_4_ + auVar139._12_4_;
            auVar191 = vsubps_avx(auVar133,auVar102);
            auVar139 = vsubps_avx(auVar133,auVar210);
            auVar190._0_4_ = fVar222 * auVar191._0_4_;
            auVar190._4_4_ = fVar167 * auVar191._4_4_;
            auVar190._8_4_ = fVar169 * auVar191._8_4_;
            auVar190._12_4_ = fVar172 * auVar191._12_4_;
            auVar211._0_4_ = fVar222 * auVar139._0_4_;
            auVar211._4_4_ = fVar167 * auVar139._4_4_;
            auVar211._8_4_ = fVar169 * auVar139._8_4_;
            auVar211._12_4_ = fVar172 * auVar139._12_4_;
            auVar103._0_4_ = fVar219 * auVar191._0_4_;
            auVar103._4_4_ = fVar198 * auVar191._4_4_;
            auVar103._8_4_ = fVar221 * auVar191._8_4_;
            auVar103._12_4_ = fVar199 * auVar191._12_4_;
            auVar137._0_4_ = fVar219 * auVar139._0_4_;
            auVar137._4_4_ = fVar198 * auVar139._4_4_;
            auVar137._8_4_ = fVar221 * auVar139._8_4_;
            auVar137._12_4_ = fVar199 * auVar139._12_4_;
            auVar191 = vminps_avx(auVar190,auVar211);
            auVar139 = vminps_avx(auVar103,auVar137);
            auVar191 = vminps_avx(auVar191,auVar139);
            auVar139 = vmaxps_avx(auVar211,auVar190);
            auVar95 = vmaxps_avx(auVar137,auVar103);
            auVar191 = vhaddps_avx(auVar191,auVar191);
            auVar139 = vmaxps_avx(auVar95,auVar139);
            auVar139 = vhaddps_avx(auVar139,auVar139);
            auVar95 = vmovshdup_avx(auVar7);
            auVar138 = ZEXT416((uint)(auVar95._0_4_ + auVar191._0_4_));
            auVar191 = vmaxss_avx(_local_5f8,auVar138);
            auVar95 = ZEXT416((uint)(auVar95._0_4_ + auVar139._0_4_));
            auVar139 = vminss_avx(auVar95,auVar74);
            auVar276._8_4_ = 0x7fffffff;
            auVar276._0_8_ = 0x7fffffff7fffffff;
            auVar276._12_4_ = 0x7fffffff;
            if (auVar191._0_4_ <= auVar139._0_4_) {
              uVar68 = 0;
              auVar334 = ZEXT864(0) << 0x20;
              if ((fVar196 < fVar218) && (uVar68 = 0, fVar197 < fVar195)) {
                auVar191 = vcmpps_avx(auVar95,auVar74,1);
                auVar139 = vcmpps_avx(_local_5f8,auVar138,1);
                auVar191 = vandps_avx(auVar139,auVar191);
                uVar68 = auVar191._0_4_;
              }
              if (((uint)uVar71 < 4 && 0.001 <= fVar216) && (uVar68 & 1) == 0) {
                bVar62 = false;
              }
              else {
                lVar72 = 200;
                do {
                  fVar218 = auVar7._0_4_;
                  fVar216 = 1.0 - fVar218;
                  auVar191 = ZEXT416((uint)(fVar216 * fVar216 * fVar216));
                  auVar191 = vshufps_avx(auVar191,auVar191,0);
                  auVar139 = ZEXT416((uint)(fVar218 * 3.0 * fVar216 * fVar216));
                  auVar139 = vshufps_avx(auVar139,auVar139,0);
                  auVar95 = ZEXT416((uint)(fVar216 * fVar218 * fVar218 * 3.0));
                  auVar95 = vshufps_avx(auVar95,auVar95,0);
                  auVar138 = ZEXT416((uint)(fVar218 * fVar218 * fVar218));
                  auVar138 = vshufps_avx(auVar138,auVar138,0);
                  fVar216 = local_538 * auVar191._0_4_ +
                            local_498 * auVar139._0_4_ +
                            (float)local_3b8._0_4_ * auVar138._0_4_ + local_4a8 * auVar95._0_4_;
                  fVar218 = fStack_534 * auVar191._4_4_ +
                            fStack_494 * auVar139._4_4_ +
                            (float)local_3b8._4_4_ * auVar138._4_4_ + fStack_4a4 * auVar95._4_4_;
                  auVar104._0_8_ = CONCAT44(fVar218,fVar216);
                  auVar104._8_4_ =
                       fStack_530 * auVar191._8_4_ +
                       fStack_490 * auVar139._8_4_ +
                       fStack_3b0 * auVar138._8_4_ + fStack_4a0 * auVar95._8_4_;
                  auVar104._12_4_ =
                       fStack_52c * auVar191._12_4_ +
                       fStack_48c * auVar139._12_4_ +
                       fStack_3ac * auVar138._12_4_ + fStack_49c * auVar95._12_4_;
                  auVar140._8_8_ = auVar104._0_8_;
                  auVar140._0_8_ = auVar104._0_8_;
                  auVar139 = vshufpd_avx(auVar104,auVar104,1);
                  auVar191 = vmovshdup_avx(auVar7);
                  auVar139 = vsubps_avx(auVar139,auVar140);
                  auVar105._0_4_ = auVar191._0_4_ * auVar139._0_4_ + fVar216;
                  auVar105._4_4_ = auVar191._4_4_ * auVar139._4_4_ + fVar218;
                  auVar105._8_4_ = auVar191._8_4_ * auVar139._8_4_ + fVar216;
                  auVar105._12_4_ = auVar191._12_4_ * auVar139._12_4_ + fVar218;
                  auVar191 = vshufps_avx(auVar105,auVar105,0);
                  auVar139 = vshufps_avx(auVar105,auVar105,0x55);
                  auVar141._0_4_ = auVar96._0_4_ * auVar191._0_4_ + auVar205._0_4_ * auVar139._0_4_;
                  auVar141._4_4_ = auVar96._4_4_ * auVar191._4_4_ + auVar205._4_4_ * auVar139._4_4_;
                  auVar141._8_4_ = auVar96._8_4_ * auVar191._8_4_ + auVar205._8_4_ * auVar139._8_4_;
                  auVar141._12_4_ =
                       auVar96._12_4_ * auVar191._12_4_ + auVar205._12_4_ * auVar139._12_4_;
                  auVar7 = vsubps_avx(auVar7,auVar141);
                  auVar191 = vandps_avx(auVar276,auVar105);
                  auVar139 = vshufps_avx(auVar191,auVar191,0xf5);
                  auVar191 = vmaxss_avx(auVar139,auVar191);
                  if (auVar191._0_4_ < fVar201) {
                    fVar216 = auVar7._0_4_;
                    if ((0.0 <= fVar216) && (fVar216 <= 1.0)) {
                      auVar96 = vmovshdup_avx(auVar7);
                      fVar218 = auVar96._0_4_;
                      if ((0.0 <= fVar218) && (fVar218 <= 1.0)) {
                        auVar96 = vinsertps_avx(ZEXT416((uint)pre->ray_space[k].vx.field_0.m128[2]),
                                                ZEXT416((uint)pre->ray_space[k].vy.field_0.m128[2]),
                                                0x1c);
                        auVar118 = vinsertps_avx(auVar96,ZEXT416((uint)pre->ray_space[k].vz.field_0.
                                                                       m128[2]),0x28);
                        auVar96 = vdpps_avx(auVar118,local_288,0x7f);
                        auVar205 = vdpps_avx(auVar118,local_298,0x7f);
                        auVar191 = vdpps_avx(auVar118,local_2a8,0x7f);
                        auVar139 = vdpps_avx(auVar118,local_2b8,0x7f);
                        auVar95 = vdpps_avx(auVar118,local_2c8,0x7f);
                        auVar138 = vdpps_avx(auVar118,local_2d8,0x7f);
                        auVar77 = vdpps_avx(auVar118,local_2e8,0x7f);
                        auVar118 = vdpps_avx(auVar118,local_2f8,0x7f);
                        fVar199 = 1.0 - fVar218;
                        fVar222 = 1.0 - fVar216;
                        fVar197 = auVar7._4_4_;
                        fVar219 = auVar7._8_4_;
                        fVar198 = auVar7._12_4_;
                        fVar221 = fVar222 * fVar216 * fVar216 * 3.0;
                        auVar233._0_4_ = fVar216 * fVar216 * fVar216;
                        auVar233._4_4_ = fVar197 * fVar197 * fVar197;
                        auVar233._8_4_ = fVar219 * fVar219 * fVar219;
                        auVar233._12_4_ = fVar198 * fVar198 * fVar198;
                        fVar219 = fVar222 * fVar222 * fVar216 * 3.0;
                        fVar198 = fVar222 * fVar222 * fVar222;
                        fVar197 = fVar198 * (fVar199 * auVar96._0_4_ + fVar218 * auVar95._0_4_) +
                                  (fVar199 * auVar205._0_4_ + auVar138._0_4_ * fVar218) * fVar219 +
                                  fVar221 * (auVar77._0_4_ * fVar218 + fVar199 * auVar191._0_4_) +
                                  auVar233._0_4_ *
                                  (fVar199 * auVar139._0_4_ + fVar218 * auVar118._0_4_);
                        if (((fVar175 <= fVar197) &&
                            (fVar199 = *(float *)(ray + k * 4 + 0x80), fVar197 <= fVar199)) &&
                           (pGVar10 = (context->scene->geometries).items[uVar67].ptr,
                           (pGVar10->mask & *(uint *)(ray + k * 4 + 0x90)) != 0)) {
                          auVar96 = vshufps_avx(auVar7,auVar7,0x55);
                          auVar266._8_4_ = 0x3f800000;
                          auVar266._0_8_ = &DAT_3f8000003f800000;
                          auVar266._12_4_ = 0x3f800000;
                          auVar205 = vsubps_avx(auVar266,auVar96);
                          fVar167 = auVar96._0_4_;
                          fVar169 = auVar96._4_4_;
                          fVar172 = auVar96._8_4_;
                          fVar173 = auVar96._12_4_;
                          fVar174 = auVar205._0_4_;
                          fVar165 = auVar205._4_4_;
                          fVar168 = auVar205._8_4_;
                          fVar170 = auVar205._12_4_;
                          auVar277._0_4_ =
                               fVar167 * (float)local_3d8._0_4_ + fVar174 * (float)local_3c8._0_4_;
                          auVar277._4_4_ =
                               fVar169 * (float)local_3d8._4_4_ + fVar165 * (float)local_3c8._4_4_;
                          auVar277._8_4_ = fVar172 * fStack_3d0 + fVar168 * fStack_3c0;
                          auVar277._12_4_ = fVar173 * fStack_3cc + fVar170 * fStack_3bc;
                          auVar289._0_4_ =
                               fVar167 * (float)local_428._0_4_ + fVar174 * (float)local_408._0_4_;
                          auVar289._4_4_ =
                               fVar169 * (float)local_428._4_4_ + fVar165 * (float)local_408._4_4_;
                          auVar289._8_4_ = fVar172 * fStack_420 + fVar168 * fStack_400;
                          auVar289._12_4_ = fVar173 * fStack_41c + fVar170 * fStack_3fc;
                          auVar302._0_4_ =
                               fVar167 * (float)local_318._0_4_ + fVar174 * (float)local_418._0_4_;
                          auVar302._4_4_ =
                               fVar169 * (float)local_318._4_4_ + fVar165 * (float)local_418._4_4_;
                          auVar302._8_4_ = fVar172 * fStack_310 + fVar168 * fStack_410;
                          auVar302._12_4_ = fVar173 * fStack_30c + fVar170 * fStack_40c;
                          auVar267._0_4_ =
                               fVar167 * (float)local_3f8._0_4_ + fVar174 * (float)local_3e8._0_4_;
                          auVar267._4_4_ =
                               fVar169 * (float)local_3f8._4_4_ + fVar165 * (float)local_3e8._4_4_;
                          auVar267._8_4_ = fVar172 * fStack_3f0 + fVar168 * fStack_3e0;
                          auVar267._12_4_ = fVar173 * fStack_3ec + fVar170 * fStack_3dc;
                          auVar95 = vsubps_avx(auVar289,auVar277);
                          auVar138 = vsubps_avx(auVar302,auVar289);
                          auVar77 = vsubps_avx(auVar267,auVar302);
                          local_1d8 = vshufps_avx(auVar7,auVar7,0);
                          fVar173 = local_1d8._0_4_;
                          fVar174 = local_1d8._4_4_;
                          fVar165 = local_1d8._8_4_;
                          fVar168 = local_1d8._12_4_;
                          auVar205 = vshufps_avx(ZEXT416((uint)fVar222),ZEXT416((uint)fVar222),0);
                          fVar222 = auVar205._0_4_;
                          fVar167 = auVar205._4_4_;
                          fVar169 = auVar205._8_4_;
                          fVar172 = auVar205._12_4_;
                          auVar205 = vshufps_avx(auVar233,auVar233,0);
                          auVar191 = vshufps_avx(ZEXT416((uint)fVar221),ZEXT416((uint)fVar221),0);
                          auVar139 = vshufps_avx(ZEXT416((uint)fVar219),ZEXT416((uint)fVar219),0);
                          auVar212._0_4_ =
                               (fVar222 * (fVar222 * auVar95._0_4_ + fVar173 * auVar138._0_4_) +
                               fVar173 * (fVar222 * auVar138._0_4_ + fVar173 * auVar77._0_4_)) * 3.0
                          ;
                          auVar212._4_4_ =
                               (fVar167 * (fVar167 * auVar95._4_4_ + fVar174 * auVar138._4_4_) +
                               fVar174 * (fVar167 * auVar138._4_4_ + fVar174 * auVar77._4_4_)) * 3.0
                          ;
                          auVar212._8_4_ =
                               (fVar169 * (fVar169 * auVar95._8_4_ + fVar165 * auVar138._8_4_) +
                               fVar165 * (fVar169 * auVar138._8_4_ + fVar165 * auVar77._8_4_)) * 3.0
                          ;
                          auVar212._12_4_ =
                               (fVar172 * (fVar172 * auVar95._12_4_ + fVar168 * auVar138._12_4_) +
                               fVar168 * (fVar172 * auVar138._12_4_ + fVar168 * auVar77._12_4_)) *
                               3.0;
                          auVar95 = vshufps_avx(ZEXT416((uint)fVar198),ZEXT416((uint)fVar198),0);
                          auVar158._0_4_ =
                               auVar95._0_4_ * (float)local_328._0_4_ +
                               auVar139._0_4_ * (float)local_338._0_4_ +
                               auVar205._0_4_ * (float)local_358._0_4_ +
                               auVar191._0_4_ * (float)local_348._0_4_;
                          auVar158._4_4_ =
                               auVar95._4_4_ * (float)local_328._4_4_ +
                               auVar139._4_4_ * (float)local_338._4_4_ +
                               auVar205._4_4_ * (float)local_358._4_4_ +
                               auVar191._4_4_ * (float)local_348._4_4_;
                          auVar158._8_4_ =
                               auVar95._8_4_ * fStack_320 +
                               auVar139._8_4_ * fStack_330 +
                               auVar205._8_4_ * fStack_350 + auVar191._8_4_ * fStack_340;
                          auVar158._12_4_ =
                               auVar95._12_4_ * fStack_31c +
                               auVar139._12_4_ * fStack_32c +
                               auVar205._12_4_ * fStack_34c + auVar191._12_4_ * fStack_33c;
                          auVar205 = vshufps_avx(auVar212,auVar212,0xc9);
                          auVar192._0_4_ = auVar158._0_4_ * auVar205._0_4_;
                          auVar192._4_4_ = auVar158._4_4_ * auVar205._4_4_;
                          auVar192._8_4_ = auVar158._8_4_ * auVar205._8_4_;
                          auVar192._12_4_ = auVar158._12_4_ * auVar205._12_4_;
                          auVar205 = vshufps_avx(auVar158,auVar158,0xc9);
                          auVar159._0_4_ = auVar212._0_4_ * auVar205._0_4_;
                          auVar159._4_4_ = auVar212._4_4_ * auVar205._4_4_;
                          auVar159._8_4_ = auVar212._8_4_ * auVar205._8_4_;
                          auVar159._12_4_ = auVar212._12_4_ * auVar205._12_4_;
                          auVar205 = vsubps_avx(auVar159,auVar192);
                          if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                             (pGVar10->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                            *(float *)(ray + k * 4 + 0x80) = fVar197;
                            uVar2 = vextractps_avx(auVar205,1);
                            *(undefined4 *)(ray + k * 4 + 0xc0) = uVar2;
                            uVar2 = vextractps_avx(auVar205,2);
                            *(undefined4 *)(ray + k * 4 + 0xd0) = uVar2;
                            *(int *)(ray + k * 4 + 0xe0) = auVar205._0_4_;
                            *(float *)(ray + k * 4 + 0xf0) = fVar216;
                            *(float *)(ray + k * 4 + 0x100) = fVar218;
                            *(uint *)(ray + k * 4 + 0x110) = uVar9;
                            *(uint *)(ray + k * 4 + 0x120) = uVar67;
                            *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                            *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                          }
                          else {
                            auVar191 = vshufps_avx(auVar205,auVar205,0x55);
                            auVar139 = vshufps_avx(auVar205,auVar205,0xaa);
                            local_1e8 = vshufps_avx(auVar205,auVar205,0);
                            local_208[0] = (RTCHitN)auVar191[0];
                            local_208[1] = (RTCHitN)auVar191[1];
                            local_208[2] = (RTCHitN)auVar191[2];
                            local_208[3] = (RTCHitN)auVar191[3];
                            local_208[4] = (RTCHitN)auVar191[4];
                            local_208[5] = (RTCHitN)auVar191[5];
                            local_208[6] = (RTCHitN)auVar191[6];
                            local_208[7] = (RTCHitN)auVar191[7];
                            local_208[8] = (RTCHitN)auVar191[8];
                            local_208[9] = (RTCHitN)auVar191[9];
                            local_208[10] = (RTCHitN)auVar191[10];
                            local_208[0xb] = (RTCHitN)auVar191[0xb];
                            local_208[0xc] = (RTCHitN)auVar191[0xc];
                            local_208[0xd] = (RTCHitN)auVar191[0xd];
                            local_208[0xe] = (RTCHitN)auVar191[0xe];
                            local_208[0xf] = (RTCHitN)auVar191[0xf];
                            local_1f8 = auVar139;
                            local_1c8 = auVar96;
                            local_1b8 = local_378._0_8_;
                            uStack_1b0 = local_378._8_8_;
                            local_1a8 = local_368._0_8_;
                            uStack_1a0 = local_368._8_8_;
                            vcmpps_avx(ZEXT832(0) << 0x20,ZEXT832(0) << 0x20,0xf);
                            uStack_194 = context->user->instID[0];
                            local_198 = uStack_194;
                            uStack_190 = uStack_194;
                            uStack_18c = uStack_194;
                            uStack_188 = context->user->instPrimID[0];
                            uStack_184 = uStack_188;
                            uStack_180 = uStack_188;
                            uStack_17c = uStack_188;
                            *(float *)(ray + k * 4 + 0x80) = fVar197;
                            local_478 = *local_460;
                            uStack_470 = local_460[1];
                            local_458.valid = (int *)&local_478;
                            local_458.geometryUserPtr = pGVar10->userPtr;
                            local_458.context = context->user;
                            local_458.hit = local_208;
                            local_458.N = 4;
                            local_458.ray = (RTCRayN *)ray;
                            if (pGVar10->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                              (*pGVar10->intersectionFilterN)(&local_458);
                              auVar334._8_56_ = extraout_var;
                              auVar334._0_8_ = extraout_XMM1_Qa;
                              auVar139 = auVar334._0_16_;
                            }
                            auVar65._8_8_ = uStack_470;
                            auVar65._0_8_ = local_478;
                            if (auVar65 == (undefined1  [16])0x0) {
                              auVar334 = ZEXT1664(ZEXT816(0));
                              auVar96 = vpcmpeqd_avx(ZEXT816(0),(undefined1  [16])0x0);
                              auVar205 = vpcmpeqd_avx(auVar139,auVar139);
                              auVar96 = auVar96 ^ auVar205;
                            }
                            else {
                              p_Var11 = context->args->filter;
                              auVar334 = ZEXT1664(ZEXT816(0));
                              auVar205 = vpcmpeqd_avx(auVar96,auVar96);
                              if ((p_Var11 != (RTCFilterFunctionN)0x0) &&
                                 (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER
                                   ) != RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                  (((pGVar10->field_8).field_0x2 & 0x40) != 0)))) {
                                (*p_Var11)(&local_458);
                                auVar205 = vpcmpeqd_avx(auVar205,auVar205);
                                auVar334 = ZEXT1664(ZEXT816(0) << 0x40);
                              }
                              auVar66._8_8_ = uStack_470;
                              auVar66._0_8_ = local_478;
                              auVar191 = vpcmpeqd_avx(auVar334._0_16_,auVar66);
                              auVar96 = auVar191 ^ auVar205;
                              if (auVar66 != (undefined1  [16])0x0) {
                                auVar191 = auVar191 ^ auVar205;
                                auVar205 = vmaskmovps_avx(auVar191,*(undefined1 (*) [16])
                                                                    local_458.hit);
                                *(undefined1 (*) [16])(local_458.ray + 0xc0) = auVar205;
                                auVar205 = vmaskmovps_avx(auVar191,*(undefined1 (*) [16])
                                                                    (local_458.hit + 0x10));
                                *(undefined1 (*) [16])(local_458.ray + 0xd0) = auVar205;
                                auVar205 = vmaskmovps_avx(auVar191,*(undefined1 (*) [16])
                                                                    (local_458.hit + 0x20));
                                *(undefined1 (*) [16])(local_458.ray + 0xe0) = auVar205;
                                auVar205 = vmaskmovps_avx(auVar191,*(undefined1 (*) [16])
                                                                    (local_458.hit + 0x30));
                                *(undefined1 (*) [16])(local_458.ray + 0xf0) = auVar205;
                                auVar205 = vmaskmovps_avx(auVar191,*(undefined1 (*) [16])
                                                                    (local_458.hit + 0x40));
                                *(undefined1 (*) [16])(local_458.ray + 0x100) = auVar205;
                                auVar205 = vmaskmovps_avx(auVar191,*(undefined1 (*) [16])
                                                                    (local_458.hit + 0x50));
                                *(undefined1 (*) [16])(local_458.ray + 0x110) = auVar205;
                                auVar205 = vmaskmovps_avx(auVar191,*(undefined1 (*) [16])
                                                                    (local_458.hit + 0x60));
                                *(undefined1 (*) [16])(local_458.ray + 0x120) = auVar205;
                                auVar205 = vmaskmovps_avx(auVar191,*(undefined1 (*) [16])
                                                                    (local_458.hit + 0x70));
                                *(undefined1 (*) [16])(local_458.ray + 0x130) = auVar205;
                                auVar205 = vmaskmovps_avx(auVar191,*(undefined1 (*) [16])
                                                                    (local_458.hit + 0x80));
                                *(undefined1 (*) [16])(local_458.ray + 0x140) = auVar205;
                              }
                            }
                            auVar106._8_8_ = 0x100000001;
                            auVar106._0_8_ = 0x100000001;
                            if ((auVar106 & auVar96) == (undefined1  [16])0x0) {
                              *(float *)(ray + k * 4 + 0x80) = fVar199;
                            }
                          }
                        }
                      }
                    }
                    break;
                  }
                  lVar72 = lVar72 + -1;
                } while (lVar72 != 0);
              }
              goto LAB_0110f26d;
            }
          }
          goto LAB_0110f283;
        }
      }
LAB_0110f26d:
    } while (bVar62);
    _local_5c8 = ZEXT416((uint)fVar196);
    local_308 = vinsertps_avx(_local_5c8,ZEXT416((uint)fVar195),0x10);
  } while( true );
}

Assistant:

static __forceinline void intersect_n(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);

          unsigned int vertexID = geom->curve(primID);
          Vec3ff a0,a1,a2,a3; Vec3fa n0,n1,n2,n3; geom->gather(a0,a1,a2,a3,n0,n1,n2,n3,vertexID);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,n0,n1,n2,n3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }